

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCRayQueryContext *pRVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [12];
  ulong uVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  byte bVar92;
  uint uVar93;
  ulong uVar94;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar95;
  byte bVar96;
  uint uVar97;
  long lVar98;
  long lVar99;
  ulong uVar100;
  bool bVar101;
  float fVar126;
  float fVar127;
  vint4 ai;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar102 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar130;
  float fVar133;
  float fVar135;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar128;
  float fVar131;
  undefined1 auVar115 [32];
  float fVar129;
  float fVar132;
  float fVar134;
  float fVar136;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar137;
  float fVar163;
  float fVar164;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar140 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar169;
  float fVar194;
  float fVar195;
  vint4 bi_2;
  undefined1 auVar175 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  float fVar196;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  vint4 bi;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [28];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  vint4 ai_1;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [28];
  float fVar248;
  undefined1 auVar239 [32];
  float fVar250;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar252;
  undefined1 auVar243 [32];
  float fVar249;
  float fVar251;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar253;
  float fVar260;
  float fVar263;
  vint4 bi_1;
  undefined1 auVar254 [16];
  float fVar267;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar261;
  float fVar262;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  undefined1 auVar258 [32];
  float fVar271;
  float fVar274;
  float fVar277;
  undefined1 auVar259 [64];
  float fVar280;
  float fVar286;
  float fVar287;
  vint4 ai_2;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar288;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar285 [64];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar301;
  float fVar304;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar326;
  float fVar327;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  float fVar328;
  float fVar329;
  float fVar335;
  float fVar337;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar336;
  float fVar338;
  float fVar340;
  undefined1 auVar333 [32];
  float fVar339;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar334 [64];
  float fVar344;
  float fVar352;
  float fVar353;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar354;
  float fVar358;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar351 [64];
  float fVar359;
  float fVar366;
  float fVar367;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar372;
  float fVar373;
  float fVar376;
  float fVar378;
  undefined1 auVar374 [16];
  float fVar377;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  undefined1 auVar375 [32];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar392;
  float fVar393;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d04;
  undefined1 local_d00 [8];
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined1 local_cc0 [8];
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 (*local_af0) [16];
  undefined1 (*local_ae8) [16];
  undefined1 (*local_ae0) [32];
  ulong local_ad8;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  Primitive *local_9d0;
  ulong local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [16];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  RTCHitN local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar365 [64];
  
  PVar9 = prim[1];
  uVar94 = (ulong)(byte)PVar9;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 5 + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  lVar98 = uVar94 * 0x25;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xf + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x11 + 6)));
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1a + 6)));
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1b + 6)));
  auVar139 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar139 = vsubps_avx(auVar139,*(undefined1 (*) [16])(prim + lVar98 + 6));
  fVar328 = *(float *)(prim + lVar98 + 0x12);
  auVar215._0_4_ = fVar328 * auVar139._0_4_;
  auVar215._4_4_ = fVar328 * auVar139._4_4_;
  auVar215._8_4_ = fVar328 * auVar139._8_4_;
  auVar215._12_4_ = fVar328 * auVar139._12_4_;
  auVar330._0_4_ = fVar328 * auVar19._0_4_;
  auVar330._4_4_ = fVar328 * auVar19._4_4_;
  auVar330._8_4_ = fVar328 * auVar19._8_4_;
  auVar330._12_4_ = fVar328 * auVar19._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar28);
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1c + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar19 = vshufps_avx(auVar330,auVar330,0x55);
  auVar28 = vshufps_avx(auVar330,auVar330,0xaa);
  fVar253 = auVar28._0_4_;
  fVar260 = auVar28._4_4_;
  fVar263 = auVar28._8_4_;
  fVar267 = auVar28._12_4_;
  fVar166 = auVar19._0_4_;
  fVar167 = auVar19._4_4_;
  fVar168 = auVar19._8_4_;
  fVar130 = auVar19._12_4_;
  auVar107 = vcvtdq2ps_avx(auVar27);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar18 = vcvtdq2ps_avx(auVar139);
  auVar139 = vshufps_avx(auVar330,auVar330,0);
  fVar328 = auVar139._0_4_;
  fVar335 = auVar139._4_4_;
  fVar337 = auVar139._8_4_;
  fVar339 = auVar139._12_4_;
  auVar295._0_4_ = fVar328 * auVar107._0_4_ + fVar166 * auVar17._0_4_ + fVar253 * auVar233._0_4_;
  auVar295._4_4_ = fVar335 * auVar107._4_4_ + fVar167 * auVar17._4_4_ + fVar260 * auVar233._4_4_;
  auVar295._8_4_ = fVar337 * auVar107._8_4_ + fVar168 * auVar17._8_4_ + fVar263 * auVar233._8_4_;
  auVar295._12_4_ = fVar339 * auVar107._12_4_ + fVar130 * auVar17._12_4_ + fVar267 * auVar233._12_4_
  ;
  auVar170._0_4_ = fVar328 * auVar141._0_4_ + fVar166 * auVar29._0_4_ + fVar253 * auVar175._0_4_;
  auVar170._4_4_ = fVar335 * auVar141._4_4_ + fVar167 * auVar29._4_4_ + fVar260 * auVar175._4_4_;
  auVar170._8_4_ = fVar337 * auVar141._8_4_ + fVar168 * auVar29._8_4_ + fVar263 * auVar175._8_4_;
  auVar170._12_4_ = fVar339 * auVar141._12_4_ + fVar130 * auVar29._12_4_ + fVar267 * auVar175._12_4_
  ;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar109 = vpmovsxwd_avx(auVar139);
  auVar139 = vcvtdq2ps_avx(auVar102);
  auVar331._0_4_ = fVar166 * auVar106._0_4_ + fVar253 * auVar18._0_4_ + fVar328 * auVar139._0_4_;
  auVar331._4_4_ = fVar167 * auVar106._4_4_ + fVar260 * auVar18._4_4_ + fVar335 * auVar139._4_4_;
  auVar331._8_4_ = fVar168 * auVar106._8_4_ + fVar263 * auVar18._8_4_ + fVar337 * auVar139._8_4_;
  auVar331._12_4_ = fVar130 * auVar106._12_4_ + fVar267 * auVar18._12_4_ + fVar339 * auVar139._12_4_
  ;
  auVar19 = vshufps_avx(auVar215,auVar215,0xaa);
  fVar253 = auVar19._0_4_;
  fVar260 = auVar19._4_4_;
  fVar263 = auVar19._8_4_;
  fVar267 = auVar19._12_4_;
  auVar19 = vshufps_avx(auVar215,auVar215,0x55);
  fVar328 = auVar19._0_4_;
  fVar337 = auVar19._4_4_;
  fVar166 = auVar19._8_4_;
  fVar168 = auVar19._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 6);
  auVar102 = vpmovsxwd_avx(auVar19);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar103 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar94 * 0xd + 6);
  auVar28 = vpmovsxwd_avx(auVar28);
  auVar19 = vshufps_avx(auVar215,auVar215,0);
  fVar335 = auVar19._0_4_;
  fVar339 = auVar19._4_4_;
  fVar167 = auVar19._8_4_;
  fVar130 = auVar19._12_4_;
  auVar318._0_4_ = auVar107._0_4_ * fVar335 + auVar17._0_4_ * fVar328 + fVar253 * auVar233._0_4_;
  auVar318._4_4_ = auVar107._4_4_ * fVar339 + auVar17._4_4_ * fVar337 + fVar260 * auVar233._4_4_;
  auVar318._8_4_ = auVar107._8_4_ * fVar167 + auVar17._8_4_ * fVar166 + fVar263 * auVar233._8_4_;
  auVar318._12_4_ = auVar107._12_4_ * fVar130 + auVar17._12_4_ * fVar168 + fVar267 * auVar233._12_4_
  ;
  auVar281._0_4_ = auVar175._0_4_ * fVar253 + auVar29._0_4_ * fVar328 + fVar335 * auVar141._0_4_;
  auVar281._4_4_ = auVar175._4_4_ * fVar260 + auVar29._4_4_ * fVar337 + fVar339 * auVar141._4_4_;
  auVar281._8_4_ = auVar175._8_4_ * fVar263 + auVar29._8_4_ * fVar166 + fVar167 * auVar141._8_4_;
  auVar281._12_4_ = auVar175._12_4_ * fVar267 + auVar29._12_4_ * fVar168 + fVar130 * auVar141._12_4_
  ;
  auVar216._0_4_ = auVar139._0_4_ * fVar335 + fVar328 * auVar106._0_4_ + fVar253 * auVar18._0_4_;
  auVar216._4_4_ = auVar139._4_4_ * fVar339 + fVar337 * auVar106._4_4_ + fVar260 * auVar18._4_4_;
  auVar216._8_4_ = auVar139._8_4_ * fVar167 + fVar166 * auVar106._8_4_ + fVar263 * auVar18._8_4_;
  auVar216._12_4_ = auVar139._12_4_ * fVar130 + fVar168 * auVar106._12_4_ + fVar267 * auVar18._12_4_
  ;
  auVar360._8_4_ = 0x7fffffff;
  auVar360._0_8_ = 0x7fffffff7fffffff;
  auVar360._12_4_ = 0x7fffffff;
  auVar139 = vandps_avx(auVar295,auVar360);
  auVar345._8_4_ = 0x219392ef;
  auVar345._0_8_ = 0x219392ef219392ef;
  auVar345._12_4_ = 0x219392ef;
  auVar139 = vcmpps_avx(auVar139,auVar345,1);
  auVar19 = vblendvps_avx(auVar295,auVar345,auVar139);
  auVar139 = vandps_avx(auVar360,auVar170);
  auVar139 = vcmpps_avx(auVar139,auVar345,1);
  auVar27 = vblendvps_avx(auVar170,auVar345,auVar139);
  auVar139 = vandps_avx(auVar331,auVar360);
  auVar139 = vcmpps_avx(auVar139,auVar345,1);
  auVar139 = vblendvps_avx(auVar331,auVar345,auVar139);
  auVar17 = vrcpps_avx(auVar19);
  fVar253 = auVar17._0_4_;
  auVar254._0_4_ = fVar253 * auVar19._0_4_;
  fVar260 = auVar17._4_4_;
  auVar254._4_4_ = fVar260 * auVar19._4_4_;
  fVar263 = auVar17._8_4_;
  auVar254._8_4_ = fVar263 * auVar19._8_4_;
  fVar267 = auVar17._12_4_;
  auVar254._12_4_ = fVar267 * auVar19._12_4_;
  auVar346._8_4_ = 0x3f800000;
  auVar346._0_8_ = 0x3f8000003f800000;
  auVar346._12_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar346,auVar254);
  fVar253 = fVar253 + fVar253 * auVar19._0_4_;
  fVar260 = fVar260 + fVar260 * auVar19._4_4_;
  fVar263 = fVar263 + fVar263 * auVar19._8_4_;
  fVar267 = fVar267 + fVar267 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar27);
  fVar292 = auVar19._0_4_;
  auVar171._0_4_ = fVar292 * auVar27._0_4_;
  fVar301 = auVar19._4_4_;
  auVar171._4_4_ = fVar301 * auVar27._4_4_;
  fVar304 = auVar19._8_4_;
  auVar171._8_4_ = fVar304 * auVar27._8_4_;
  fVar307 = auVar19._12_4_;
  auVar171._12_4_ = fVar307 * auVar27._12_4_;
  auVar19 = vsubps_avx(auVar346,auVar171);
  fVar292 = fVar292 + fVar292 * auVar19._0_4_;
  fVar301 = fVar301 + fVar301 * auVar19._4_4_;
  fVar304 = fVar304 + fVar304 * auVar19._8_4_;
  fVar307 = fVar307 + fVar307 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar139);
  fVar328 = auVar19._0_4_;
  auVar332._0_4_ = auVar139._0_4_ * fVar328;
  fVar335 = auVar19._4_4_;
  auVar332._4_4_ = auVar139._4_4_ * fVar335;
  fVar337 = auVar19._8_4_;
  auVar332._8_4_ = auVar139._8_4_ * fVar337;
  fVar339 = auVar19._12_4_;
  auVar332._12_4_ = auVar139._12_4_ * fVar339;
  auVar139 = vsubps_avx(auVar346,auVar332);
  fVar328 = auVar139._0_4_ * fVar328 + fVar328;
  fVar335 = auVar139._4_4_ * fVar335 + fVar335;
  fVar337 = auVar139._8_4_ * fVar337 + fVar337;
  fVar339 = auVar139._12_4_ * fVar339 + fVar339;
  auVar27 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar98 + 0x16)) *
                                        *(float *)(prim + lVar98 + 0x1a))),0);
  auVar139 = vcvtdq2ps_avx(auVar109);
  auVar19 = vcvtdq2ps_avx(auVar102);
  auVar19 = vsubps_avx(auVar19,auVar139);
  fVar166 = auVar27._0_4_;
  fVar167 = auVar27._4_4_;
  fVar168 = auVar27._8_4_;
  fVar130 = auVar27._12_4_;
  auVar102._0_4_ = fVar166 * auVar19._0_4_ + auVar139._0_4_;
  auVar102._4_4_ = fVar167 * auVar19._4_4_ + auVar139._4_4_;
  auVar102._8_4_ = fVar168 * auVar19._8_4_ + auVar139._8_4_;
  auVar102._12_4_ = fVar130 * auVar19._12_4_ + auVar139._12_4_;
  auVar139 = vcvtdq2ps_avx(auVar103);
  auVar19 = vcvtdq2ps_avx(auVar28);
  auVar27 = vsubps_avx(auVar19,auVar139);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar94 * 0x12 + 6);
  auVar19 = vpmovsxwd_avx(auVar17);
  auVar197._0_4_ = fVar166 * auVar27._0_4_ + auVar139._0_4_;
  auVar197._4_4_ = fVar167 * auVar27._4_4_ + auVar139._4_4_;
  auVar197._8_4_ = fVar168 * auVar27._8_4_ + auVar139._8_4_;
  auVar197._12_4_ = fVar130 * auVar27._12_4_ + auVar139._12_4_;
  auVar139 = vcvtdq2ps_avx(auVar19);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar94 * 0x16 + 6);
  auVar19 = vpmovsxwd_avx(auVar233);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar139);
  auVar230._0_4_ = auVar19._0_4_ * fVar166 + auVar139._0_4_;
  auVar230._4_4_ = auVar19._4_4_ * fVar167 + auVar139._4_4_;
  auVar230._8_4_ = auVar19._8_4_ * fVar168 + auVar139._8_4_;
  auVar230._12_4_ = auVar19._12_4_ * fVar130 + auVar139._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar94 * 0x14 + 6);
  auVar139 = vpmovsxwd_avx(auVar29);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar94 * 0x18 + 6);
  auVar19 = vpmovsxwd_avx(auVar175);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar139);
  auVar347._0_4_ = auVar19._0_4_ * fVar166 + auVar139._0_4_;
  auVar347._4_4_ = auVar19._4_4_ * fVar167 + auVar139._4_4_;
  auVar347._8_4_ = auVar19._8_4_ * fVar168 + auVar139._8_4_;
  auVar347._12_4_ = auVar19._12_4_ * fVar130 + auVar139._12_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar94 * 0x1d + 6);
  auVar139 = vpmovsxwd_avx(auVar107);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar94 * 0x21 + 6);
  auVar19 = vpmovsxwd_avx(auVar141);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar139);
  auVar361._0_4_ = auVar19._0_4_ * fVar166 + auVar139._0_4_;
  auVar361._4_4_ = auVar19._4_4_ * fVar167 + auVar139._4_4_;
  auVar361._8_4_ = auVar19._8_4_ * fVar168 + auVar139._8_4_;
  auVar361._12_4_ = auVar19._12_4_ * fVar130 + auVar139._12_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar94 * 0x1f + 6);
  auVar139 = vpmovsxwd_avx(auVar106);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar94 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar139);
  auVar172._0_4_ = auVar139._0_4_ + auVar19._0_4_ * fVar166;
  auVar172._4_4_ = auVar139._4_4_ + auVar19._4_4_ * fVar167;
  auVar172._8_4_ = auVar139._8_4_ + auVar19._8_4_ * fVar168;
  auVar172._12_4_ = auVar139._12_4_ + auVar19._12_4_ * fVar130;
  auVar139 = vsubps_avx(auVar102,auVar318);
  auVar109._0_4_ = fVar253 * auVar139._0_4_;
  auVar109._4_4_ = fVar260 * auVar139._4_4_;
  auVar109._8_4_ = fVar263 * auVar139._8_4_;
  auVar109._12_4_ = fVar267 * auVar139._12_4_;
  auVar139 = vsubps_avx(auVar197,auVar318);
  auVar198._0_4_ = fVar253 * auVar139._0_4_;
  auVar198._4_4_ = fVar260 * auVar139._4_4_;
  auVar198._8_4_ = fVar263 * auVar139._8_4_;
  auVar198._12_4_ = fVar267 * auVar139._12_4_;
  auVar139 = vsubps_avx(auVar230,auVar281);
  auVar231._0_4_ = fVar292 * auVar139._0_4_;
  auVar231._4_4_ = fVar301 * auVar139._4_4_;
  auVar231._8_4_ = fVar304 * auVar139._8_4_;
  auVar231._12_4_ = fVar307 * auVar139._12_4_;
  auVar139 = vsubps_avx(auVar347,auVar281);
  auVar255._0_4_ = fVar292 * auVar139._0_4_;
  auVar255._4_4_ = fVar301 * auVar139._4_4_;
  auVar255._8_4_ = fVar304 * auVar139._8_4_;
  auVar255._12_4_ = fVar307 * auVar139._12_4_;
  auVar139 = vsubps_avx(auVar361,auVar216);
  auVar282._0_4_ = fVar328 * auVar139._0_4_;
  auVar282._4_4_ = fVar335 * auVar139._4_4_;
  auVar282._8_4_ = fVar337 * auVar139._8_4_;
  auVar282._12_4_ = fVar339 * auVar139._12_4_;
  auVar139 = vsubps_avx(auVar172,auVar216);
  auVar173._0_4_ = fVar328 * auVar139._0_4_;
  auVar173._4_4_ = fVar335 * auVar139._4_4_;
  auVar173._8_4_ = fVar337 * auVar139._8_4_;
  auVar173._12_4_ = fVar339 * auVar139._12_4_;
  auVar139 = vpminsd_avx(auVar109,auVar198);
  auVar19 = vpminsd_avx(auVar231,auVar255);
  auVar139 = vmaxps_avx(auVar139,auVar19);
  auVar19 = vpminsd_avx(auVar282,auVar173);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar319._4_4_ = uVar8;
  auVar319._0_4_ = uVar8;
  auVar319._8_4_ = uVar8;
  auVar319._12_4_ = uVar8;
  auVar19 = vmaxps_avx(auVar19,auVar319);
  auVar139 = vmaxps_avx(auVar139,auVar19);
  local_800._0_4_ = auVar139._0_4_ * 0.99999964;
  local_800._4_4_ = auVar139._4_4_ * 0.99999964;
  local_800._8_4_ = auVar139._8_4_ * 0.99999964;
  local_800._12_4_ = auVar139._12_4_ * 0.99999964;
  auVar139 = vpmaxsd_avx(auVar109,auVar198);
  auVar19 = vpmaxsd_avx(auVar231,auVar255);
  auVar139 = vminps_avx(auVar139,auVar19);
  auVar19 = vpmaxsd_avx(auVar282,auVar173);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar199._4_4_ = uVar8;
  auVar199._0_4_ = uVar8;
  auVar199._8_4_ = uVar8;
  auVar199._12_4_ = uVar8;
  auVar19 = vminps_avx(auVar19,auVar199);
  auVar139 = vminps_avx(auVar139,auVar19);
  auVar103._0_4_ = auVar139._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar139._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar139._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar139._12_4_ * 1.0000004;
  auVar139 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar19 = vpcmpgtd_avx(auVar139,_DAT_01f4ad30);
  auVar139 = vcmpps_avx(local_800,auVar103,2);
  auVar139 = vandps_avx(auVar139,auVar19);
  uVar97 = vmovmskps_avx(auVar139);
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_5c0 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  local_ae0 = (undefined1 (*) [32])&local_700;
  uVar95 = 1 << ((byte)k & 0x1f);
  local_ae8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar95 & 0xf) << 4));
  local_af0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar95 >> 4) * 0x10);
  auVar325 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_9d0 = prim;
LAB_008d0a66:
  local_9c8 = (ulong)uVar97;
  if (local_9c8 == 0) {
LAB_008d36c0:
    return local_9c8 != 0;
  }
  lVar98 = 0;
  if (local_9c8 != 0) {
    for (; (uVar97 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
    }
  }
  local_ad8 = (ulong)*(uint *)(local_9d0 + 2);
  pGVar10 = (context->scene->geometries).items[local_ad8].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(local_9d0 + lVar98 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar328 = (pGVar10->time_range).lower;
  fVar328 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar328) / ((pGVar10->time_range).upper - fVar328));
  auVar139 = vroundss_avx(ZEXT416((uint)fVar328),ZEXT416((uint)fVar328),9);
  auVar139 = vminss_avx(auVar139,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar139 = vmaxss_avx(ZEXT816(0) << 0x20,auVar139);
  fVar328 = fVar328 - auVar139._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar99 = (long)(int)auVar139._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + 0x10 + lVar99);
  lVar13 = *(long *)(_Var11 + 0x38 + lVar99);
  lVar14 = *(long *)(_Var11 + 0x48 + lVar99);
  auVar139 = vshufps_avx(ZEXT416((uint)fVar328),ZEXT416((uint)fVar328),0);
  pfVar1 = (float *)(lVar13 + uVar94 * lVar14);
  fVar167 = auVar139._0_4_;
  fVar168 = auVar139._4_4_;
  fVar130 = auVar139._8_4_;
  fVar253 = auVar139._12_4_;
  pfVar2 = (float *)(lVar13 + (uVar94 + 1) * lVar14);
  pfVar3 = (float *)(lVar13 + (uVar94 + 2) * lVar14);
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar94 + 3));
  lVar13 = *(long *)(_Var11 + lVar99);
  auVar139 = vshufps_avx(ZEXT416((uint)(1.0 - fVar328)),ZEXT416((uint)(1.0 - fVar328)),0);
  pfVar5 = (float *)(lVar13 + lVar12 * uVar94);
  fVar335 = auVar139._0_4_;
  fVar337 = auVar139._4_4_;
  fVar339 = auVar139._8_4_;
  fVar166 = auVar139._12_4_;
  pfVar6 = (float *)(lVar13 + lVar12 * (uVar94 + 1));
  pfVar7 = (float *)(lVar13 + lVar12 * (uVar94 + 2));
  auVar174._0_4_ = fVar167 * *pfVar1 + fVar335 * *pfVar5;
  auVar174._4_4_ = fVar168 * pfVar1[1] + fVar337 * pfVar5[1];
  auVar174._8_4_ = fVar130 * pfVar1[2] + fVar339 * pfVar5[2];
  auVar174._12_4_ = fVar253 * pfVar1[3] + fVar166 * pfVar5[3];
  auVar138._0_4_ = fVar335 * *pfVar6 + fVar167 * *pfVar2;
  auVar138._4_4_ = fVar337 * pfVar6[1] + fVar168 * pfVar2[1];
  auVar138._8_4_ = fVar339 * pfVar6[2] + fVar130 * pfVar2[2];
  auVar138._12_4_ = fVar166 * pfVar6[3] + fVar253 * pfVar2[3];
  pfVar1 = (float *)(lVar13 + lVar12 * (uVar94 + 3));
  auVar200._0_4_ = fVar335 * *pfVar7 + fVar167 * *pfVar3;
  auVar200._4_4_ = fVar337 * pfVar7[1] + fVar168 * pfVar3[1];
  auVar200._8_4_ = fVar339 * pfVar7[2] + fVar130 * pfVar3[2];
  auVar200._12_4_ = fVar166 * pfVar7[3] + fVar253 * pfVar3[3];
  auVar139 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar19 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar328 = *(float *)(ray + k * 4 + 0x80);
  auVar362._4_4_ = fVar328;
  auVar362._0_4_ = fVar328;
  auVar362._8_4_ = fVar328;
  auVar362._12_4_ = fVar328;
  fStack_8d0 = fVar328;
  _local_8e0 = auVar362;
  fStack_8cc = fVar328;
  fStack_8c8 = fVar328;
  fStack_8c4 = fVar328;
  auVar365 = ZEXT3264(_local_8e0);
  auVar232._0_4_ = fVar335 * *pfVar1 + fVar167 * *pfVar4;
  auVar232._4_4_ = fVar337 * pfVar1[1] + fVar168 * pfVar4[1];
  auVar232._8_4_ = fVar339 * pfVar1[2] + fVar130 * pfVar4[2];
  auVar232._12_4_ = fVar166 * pfVar1[3] + fVar253 * pfVar4[3];
  fVar335 = *(float *)(ray + k * 4 + 0xa0);
  auVar374._4_4_ = fVar335;
  auVar374._0_4_ = fVar335;
  auVar374._8_4_ = fVar335;
  auVar374._12_4_ = fVar335;
  fStack_8f0 = fVar335;
  _local_900 = auVar374;
  fStack_8ec = fVar335;
  fStack_8e8 = fVar335;
  fStack_8e4 = fVar335;
  auVar139 = vunpcklps_avx(auVar362,auVar374);
  fVar337 = *(float *)(ray + k * 4 + 0xc0);
  auVar388._4_4_ = fVar337;
  auVar388._0_4_ = fVar337;
  auVar388._8_4_ = fVar337;
  auVar388._12_4_ = fVar337;
  fStack_910 = fVar337;
  _local_920 = auVar388;
  fStack_90c = fVar337;
  fStack_908 = fVar337;
  fStack_904 = fVar337;
  _local_a50 = vinsertps_avx(auVar139,auVar388,0x28);
  auVar334 = ZEXT1664(_local_a50);
  auVar104._0_4_ = (auVar174._0_4_ + auVar138._0_4_ + auVar200._0_4_ + auVar232._0_4_) * 0.25;
  auVar104._4_4_ = (auVar174._4_4_ + auVar138._4_4_ + auVar200._4_4_ + auVar232._4_4_) * 0.25;
  auVar104._8_4_ = (auVar174._8_4_ + auVar138._8_4_ + auVar200._8_4_ + auVar232._8_4_) * 0.25;
  auVar104._12_4_ = (auVar174._12_4_ + auVar138._12_4_ + auVar200._12_4_ + auVar232._12_4_) * 0.25;
  auVar139 = vsubps_avx(auVar104,auVar19);
  auVar139 = vdpps_avx(auVar139,_local_a50,0x7f);
  local_a60 = vdpps_avx(_local_a50,_local_a50,0x7f);
  auVar351 = ZEXT1664(local_a60);
  auVar27 = vrcpss_avx(local_a60,local_a60);
  fVar339 = auVar139._0_4_ * auVar27._0_4_ * (2.0 - local_a60._0_4_ * auVar27._0_4_);
  auVar285 = ZEXT464((uint)fVar339);
  auVar27 = vshufps_avx(ZEXT416((uint)fVar339),ZEXT416((uint)fVar339),0);
  auVar217._0_4_ = auVar19._0_4_ + local_a50._0_4_ * auVar27._0_4_;
  auVar217._4_4_ = auVar19._4_4_ + local_a50._4_4_ * auVar27._4_4_;
  auVar217._8_4_ = auVar19._8_4_ + local_a50._8_4_ * auVar27._8_4_;
  auVar217._12_4_ = auVar19._12_4_ + local_a50._12_4_ * auVar27._12_4_;
  auVar139 = vblendps_avx(auVar217,_DAT_01f45a50,8);
  auVar28 = vsubps_avx(auVar174,auVar139);
  auVar259 = ZEXT1664(auVar28);
  auVar17 = vsubps_avx(auVar200,auVar139);
  _local_b30 = vsubps_avx(auVar138,auVar139);
  _local_b40 = vsubps_avx(auVar232,auVar139);
  auVar19 = vshufps_avx(auVar28,auVar28,0);
  auVar139 = vshufps_avx(auVar28,auVar28,0x55);
  register0x00001250 = auVar139;
  _local_1e0 = auVar139;
  auVar139 = vshufps_avx(auVar28,auVar28,0xaa);
  register0x00001250 = auVar139;
  _local_200 = auVar139;
  auVar139 = vshufps_avx(auVar28,auVar28,0xff);
  register0x00001290 = auVar139;
  _local_220 = auVar139;
  auVar139 = vshufps_avx(_local_b30,_local_b30,0);
  register0x00001290 = auVar139;
  _local_240 = auVar139;
  auVar139 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001290 = auVar139;
  _local_260 = auVar139;
  auVar139 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar139;
  _local_280 = auVar139;
  auVar139 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar139;
  _local_4a0 = auVar139;
  auVar139 = vshufps_avx(auVar17,auVar17,0);
  register0x00001290 = auVar139;
  _local_4c0 = auVar139;
  auVar139 = vshufps_avx(auVar17,auVar17,0x55);
  register0x00001290 = auVar139;
  _local_4e0 = auVar139;
  auVar139 = vshufps_avx(auVar17,auVar17,0xaa);
  register0x00001290 = auVar139;
  _local_500 = auVar139;
  auVar139 = vshufps_avx(auVar17,auVar17,0xff);
  register0x00001290 = auVar139;
  _local_520 = auVar139;
  auVar139 = vshufps_avx(_local_b40,_local_b40,0);
  register0x00001290 = auVar139;
  _local_540 = auVar139;
  auVar139 = vshufps_avx(_local_b40,_local_b40,0x55);
  register0x00001290 = auVar139;
  _local_560 = auVar139;
  auVar139 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar139;
  _local_580 = auVar139;
  auVar139 = vshufps_avx(_local_b40,_local_b40,0xff);
  register0x00001290 = auVar139;
  _local_5a0 = auVar139;
  auVar139 = ZEXT416((uint)(fVar328 * fVar328 + fVar335 * fVar335 + fVar337 * fVar337));
  auVar139 = vshufps_avx(auVar139,auVar139,0);
  local_2a0._16_16_ = auVar139;
  local_2a0._0_16_ = auVar139;
  fVar328 = *(float *)(ray + k * 4 + 0x60);
  local_9e0 = ZEXT416((uint)fVar339);
  auVar139 = vshufps_avx(ZEXT416((uint)(fVar328 - fVar339)),ZEXT416((uint)(fVar328 - fVar339)),0);
  local_340._16_16_ = auVar139;
  local_340._0_16_ = auVar139;
  auVar139 = vpshufd_avx(ZEXT416(*(uint *)(local_9d0 + 2)),0);
  local_640._16_16_ = auVar139;
  local_640._0_16_ = auVar139;
  auVar139 = vpshufd_avx(ZEXT416(*(uint *)(local_9d0 + lVar98 * 4 + 6)),0);
  local_660._16_16_ = auVar139;
  local_660._0_16_ = auVar139;
  register0x00001210 = auVar27;
  _local_8c0 = auVar27;
  uVar97 = 0;
  bVar96 = 0;
  local_d04 = 1;
  local_620 = vandps_avx(auVar325._0_32_,local_2a0);
  auVar139 = vsqrtss_avx(local_a60,local_a60);
  auVar27 = vsqrtss_avx(local_a60,local_a60);
  local_7f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar239._8_4_ = 0x3f800000;
    auVar239._0_8_ = 0x3f8000003f800000;
    auVar239._12_4_ = 0x3f800000;
    auVar239._16_4_ = 0x3f800000;
    auVar239._20_4_ = 0x3f800000;
    auVar239._24_4_ = 0x3f800000;
    auVar239._28_4_ = 0x3f800000;
    auVar233 = vmovshdup_avx(local_7f0);
    auVar175 = vsubps_avx(auVar233,local_7f0);
    auVar233 = vshufps_avx(local_7f0,local_7f0,0);
    auVar186._16_16_ = auVar233;
    auVar186._0_16_ = auVar233;
    auVar29 = vshufps_avx(auVar175,auVar175,0);
    fVar137 = auVar29._0_4_;
    fVar163 = auVar29._4_4_;
    fVar164 = auVar29._8_4_;
    fVar165 = auVar29._12_4_;
    fVar169 = auVar233._0_4_;
    auVar211._0_4_ = fVar169 + fVar137 * 0.0;
    fVar194 = auVar233._4_4_;
    auVar211._4_4_ = fVar194 + fVar163 * 0.14285715;
    fVar195 = auVar233._8_4_;
    auVar211._8_4_ = fVar195 + fVar164 * 0.2857143;
    fVar196 = auVar233._12_4_;
    auVar211._12_4_ = fVar196 + fVar165 * 0.42857146;
    auVar211._16_4_ = fVar169 + fVar137 * 0.5714286;
    auVar211._20_4_ = fVar194 + fVar163 * 0.71428573;
    auVar211._24_4_ = fVar195 + fVar164 * 0.8571429;
    auVar211._28_4_ = fVar196 + fVar165;
    auVar113 = vsubps_avx(auVar239,auVar211);
    fVar335 = auVar113._0_4_;
    fVar337 = auVar113._4_4_;
    fVar339 = auVar113._8_4_;
    fVar166 = auVar113._12_4_;
    fVar167 = auVar113._16_4_;
    fVar168 = auVar113._20_4_;
    fVar130 = auVar113._24_4_;
    fVar267 = fVar335 * fVar335 * fVar335;
    fVar307 = fVar337 * fVar337 * fVar337;
    fVar264 = fVar339 * fVar339 * fVar339;
    fVar268 = fVar166 * fVar166 * fVar166;
    fVar271 = fVar167 * fVar167 * fVar167;
    fVar274 = fVar168 * fVar168 * fVar168;
    fVar277 = fVar130 * fVar130 * fVar130;
    fVar280 = auVar211._0_4_ * auVar211._0_4_ * auVar211._0_4_;
    fVar286 = auVar211._4_4_ * auVar211._4_4_ * auVar211._4_4_;
    fVar287 = auVar211._8_4_ * auVar211._8_4_ * auVar211._8_4_;
    fVar288 = auVar211._12_4_ * auVar211._12_4_ * auVar211._12_4_;
    fVar289 = auVar211._16_4_ * auVar211._16_4_ * auVar211._16_4_;
    fVar290 = auVar211._20_4_ * auVar211._20_4_ * auVar211._20_4_;
    fVar291 = auVar211._24_4_ * auVar211._24_4_ * auVar211._24_4_;
    fVar253 = auVar211._0_4_ * fVar335;
    fVar260 = auVar211._4_4_ * fVar337;
    fVar263 = auVar211._8_4_ * fVar339;
    fVar301 = auVar211._12_4_ * fVar166;
    fVar304 = auVar211._16_4_ * fVar167;
    fVar248 = auVar211._20_4_ * fVar168;
    fVar250 = auVar211._24_4_ * fVar130;
    fVar292 = auVar334._28_4_ + auVar365._28_4_;
    fVar316 = auVar285._28_4_ + 1.0 + fVar292;
    fVar326 = fVar292 + auVar259._28_4_ + auVar351._28_4_ + auVar325._28_4_;
    fVar292 = fVar267 * 0.16666667;
    fVar261 = fVar307 * 0.16666667;
    fVar265 = fVar264 * 0.16666667;
    fVar269 = fVar268 * 0.16666667;
    fVar272 = fVar271 * 0.16666667;
    fVar275 = fVar274 * 0.16666667;
    fVar278 = fVar277 * 0.16666667;
    fVar293 = (fVar280 + fVar267 * 4.0 + fVar335 * fVar253 * 12.0 + auVar211._0_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar302 = (fVar286 + fVar307 * 4.0 + fVar337 * fVar260 * 12.0 + auVar211._4_4_ * fVar260 * 6.0)
              * 0.16666667;
    fVar305 = (fVar287 + fVar264 * 4.0 + fVar339 * fVar263 * 12.0 + auVar211._8_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar308 = (fVar288 + fVar268 * 4.0 + fVar166 * fVar301 * 12.0 + auVar211._12_4_ * fVar301 * 6.0)
              * 0.16666667;
    fVar310 = (fVar289 + fVar271 * 4.0 + fVar167 * fVar304 * 12.0 + auVar211._16_4_ * fVar304 * 6.0)
              * 0.16666667;
    fVar312 = (fVar290 + fVar274 * 4.0 + fVar168 * fVar248 * 12.0 + auVar211._20_4_ * fVar248 * 6.0)
              * 0.16666667;
    fVar314 = (fVar291 + fVar277 * 4.0 + fVar130 * fVar250 * 12.0 + auVar211._24_4_ * fVar250 * 6.0)
              * 0.16666667;
    fVar267 = (fVar280 * 4.0 + fVar267 + auVar211._0_4_ * fVar253 * 12.0 + fVar335 * fVar253 * 6.0)
              * 0.16666667;
    fVar307 = (fVar286 * 4.0 + fVar307 + auVar211._4_4_ * fVar260 * 12.0 + fVar337 * fVar260 * 6.0)
              * 0.16666667;
    fVar264 = (fVar287 * 4.0 + fVar264 + auVar211._8_4_ * fVar263 * 12.0 + fVar339 * fVar263 * 6.0)
              * 0.16666667;
    fVar268 = (fVar288 * 4.0 + fVar268 + auVar211._12_4_ * fVar301 * 12.0 + fVar166 * fVar301 * 6.0)
              * 0.16666667;
    fVar271 = (fVar289 * 4.0 + fVar271 + auVar211._16_4_ * fVar304 * 12.0 + fVar167 * fVar304 * 6.0)
              * 0.16666667;
    fVar274 = (fVar290 * 4.0 + fVar274 + auVar211._20_4_ * fVar248 * 12.0 + fVar168 * fVar248 * 6.0)
              * 0.16666667;
    fVar277 = (fVar291 * 4.0 + fVar277 + auVar211._24_4_ * fVar250 * 12.0 + fVar130 * fVar250 * 6.0)
              * 0.16666667;
    fVar280 = fVar280 * 0.16666667;
    fVar286 = fVar286 * 0.16666667;
    fVar287 = fVar287 * 0.16666667;
    fVar288 = fVar288 * 0.16666667;
    fVar289 = fVar289 * 0.16666667;
    fVar290 = fVar290 * 0.16666667;
    fVar291 = fVar291 * 0.16666667;
    fVar358 = auVar351._28_4_ + 12.0;
    fVar327 = fVar326 + 12.166667;
    fVar392 = auVar19._0_4_;
    fVar393 = auVar19._4_4_;
    fVar249 = auVar19._8_4_;
    local_a20 = fVar392 * fVar292 +
                (float)local_240._0_4_ * fVar293 +
                fVar280 * (float)local_540._0_4_ + fVar267 * (float)local_4c0._0_4_;
    fStack_a1c = fVar393 * fVar261 +
                 (float)local_240._4_4_ * fVar302 +
                 fVar286 * (float)local_540._4_4_ + fVar307 * (float)local_4c0._4_4_;
    fStack_a18 = fVar249 * fVar265 +
                 fStack_238 * fVar305 + fVar287 * fStack_538 + fVar264 * fStack_4b8;
    fStack_a14 = auVar19._12_4_ * fVar269 +
                 fStack_234 * fVar308 + fVar288 * fStack_534 + fVar268 * fStack_4b4;
    fStack_a10 = fVar392 * fVar272 +
                 fStack_230 * fVar310 + fVar289 * fStack_530 + fVar271 * fStack_4b0;
    fStack_a0c = fVar393 * fVar275 +
                 fStack_22c * fVar312 + fVar290 * fStack_52c + fVar274 * fStack_4ac;
    fStack_a08 = fVar249 * fVar278 +
                 fStack_228 * fVar314 + fVar291 * fStack_528 + fVar277 * fStack_4a8;
    fStack_a04 = fVar316 + fVar327;
    fVar294 = (float)local_1e0._0_4_ * fVar292 +
              fVar293 * (float)local_260._0_4_ +
              fVar280 * (float)local_560._0_4_ + fVar267 * (float)local_4e0._0_4_;
    fVar303 = (float)local_1e0._4_4_ * fVar261 +
              fVar302 * (float)local_260._4_4_ +
              fVar286 * (float)local_560._4_4_ + fVar307 * (float)local_4e0._4_4_;
    fVar306 = fStack_1d8 * fVar265 +
              fVar305 * fStack_258 + fVar287 * fStack_558 + fVar264 * fStack_4d8;
    fVar309 = fStack_1d4 * fVar269 +
              fVar308 * fStack_254 + fVar288 * fStack_554 + fVar268 * fStack_4d4;
    fVar311 = fStack_1d0 * fVar272 +
              fVar310 * fStack_250 + fVar289 * fStack_550 + fVar271 * fStack_4d0;
    fVar313 = fStack_1cc * fVar275 +
              fVar312 * fStack_24c + fVar290 * fStack_54c + fVar274 * fStack_4cc;
    fVar315 = fStack_1c8 * fVar278 +
              fVar314 * fStack_248 + fVar291 * fStack_548 + fVar277 * fStack_4c8;
    fVar317 = fStack_a04 + fVar358 + 12.166667;
    local_d00._0_4_ =
         (float)local_200._0_4_ * fVar292 +
         (float)local_280._0_4_ * fVar293 +
         fVar280 * (float)local_580._0_4_ + fVar267 * (float)local_500._0_4_;
    local_d00._4_4_ =
         (float)local_200._4_4_ * fVar261 +
         (float)local_280._4_4_ * fVar302 +
         fVar286 * (float)local_580._4_4_ + fVar307 * (float)local_500._4_4_;
    fStack_cf8 = fStack_1f8 * fVar265 +
                 fStack_278 * fVar305 + fVar287 * fStack_578 + fVar264 * fStack_4f8;
    fStack_cf4 = fStack_1f4 * fVar269 +
                 fStack_274 * fVar308 + fVar288 * fStack_574 + fVar268 * fStack_4f4;
    fStack_cf0 = fStack_1f0 * fVar272 +
                 fStack_270 * fVar310 + fVar289 * fStack_570 + fVar271 * fStack_4f0;
    fStack_cec = fStack_1ec * fVar275 +
                 fStack_26c * fVar312 + fVar290 * fStack_56c + fVar274 * fStack_4ec;
    fStack_ce8 = fStack_1e8 * fVar278 +
                 fStack_268 * fVar314 + fVar291 * fStack_568 + fVar277 * fStack_4e8;
    fStack_ce4 = fVar317 + fVar358 + auVar365._28_4_ + 12.0;
    local_b20._0_4_ =
         (float)local_220._0_4_ * fVar292 +
         fVar293 * (float)local_4a0._0_4_ +
         fVar267 * (float)local_520._0_4_ + fVar280 * (float)local_5a0._0_4_;
    local_b20._4_4_ =
         (float)local_220._4_4_ * fVar261 +
         fVar302 * (float)local_4a0._4_4_ +
         fVar307 * (float)local_520._4_4_ + fVar286 * (float)local_5a0._4_4_;
    fStack_b18 = fStack_218 * fVar265 +
                 fVar305 * fStack_498 + fVar264 * fStack_518 + fVar287 * fStack_598;
    fStack_b14 = fStack_214 * fVar269 +
                 fVar308 * fStack_494 + fVar268 * fStack_514 + fVar288 * fStack_594;
    fStack_b10 = fStack_210 * fVar272 +
                 fVar310 * fStack_490 + fVar271 * fStack_510 + fVar289 * fStack_590;
    fStack_b0c = fStack_20c * fVar275 +
                 fVar312 * fStack_48c + fVar274 * fStack_50c + fVar290 * fStack_58c;
    fStack_b08 = fStack_208 * fVar278 +
                 fVar314 * fStack_488 + fVar277 * fStack_508 + fVar291 * fStack_588;
    fStack_b04 = auVar259._28_4_ + fVar316 + fVar326 + auVar285._28_4_;
    auVar33._4_4_ = auVar211._4_4_ * -auVar211._4_4_;
    auVar33._0_4_ = auVar211._0_4_ * -auVar211._0_4_;
    auVar33._8_4_ = auVar211._8_4_ * -auVar211._8_4_;
    auVar33._12_4_ = auVar211._12_4_ * -auVar211._12_4_;
    auVar33._16_4_ = auVar211._16_4_ * -auVar211._16_4_;
    auVar33._20_4_ = auVar211._20_4_ * -auVar211._20_4_;
    auVar33._24_4_ = auVar211._24_4_ * -auVar211._24_4_;
    auVar33._28_4_ = auVar211._28_4_;
    auVar34._4_4_ = fVar260 * 4.0;
    auVar34._0_4_ = fVar253 * 4.0;
    auVar34._8_4_ = fVar263 * 4.0;
    auVar34._12_4_ = fVar301 * 4.0;
    auVar34._16_4_ = fVar304 * 4.0;
    auVar34._20_4_ = fVar248 * 4.0;
    auVar34._24_4_ = fVar250 * 4.0;
    auVar34._28_4_ = 0x3f800000;
    auVar113 = vsubps_avx(auVar33,auVar34);
    fVar272 = fVar335 * -fVar335 * 0.5;
    fVar277 = fVar337 * -fVar337 * 0.5;
    fVar278 = fVar339 * -fVar339 * 0.5;
    fVar280 = fVar166 * -fVar166 * 0.5;
    fVar286 = fVar167 * -fVar167 * 0.5;
    fVar287 = fVar168 * -fVar168 * 0.5;
    fVar288 = fVar130 * -fVar130 * 0.5;
    fVar307 = auVar113._0_4_ * 0.5;
    fVar261 = auVar113._4_4_ * 0.5;
    fVar265 = auVar113._8_4_ * 0.5;
    fVar268 = auVar113._12_4_ * 0.5;
    fVar269 = auVar113._16_4_ * 0.5;
    fVar274 = auVar113._20_4_ * 0.5;
    fVar275 = auVar113._24_4_ * 0.5;
    fVar253 = (fVar335 * fVar335 + fVar253 * 4.0) * 0.5;
    fVar267 = (fVar337 * fVar337 + fVar260 * 4.0) * 0.5;
    fVar292 = (fVar339 * fVar339 + fVar263 * 4.0) * 0.5;
    fVar301 = (fVar166 * fVar166 + fVar301 * 4.0) * 0.5;
    fVar304 = (fVar167 * fVar167 + fVar304 * 4.0) * 0.5;
    fVar264 = (fVar168 * fVar168 + fVar248 * 4.0) * 0.5;
    fVar250 = (fVar130 * fVar130 + fVar250 * 4.0) * 0.5;
    fVar335 = auVar211._0_4_ * auVar211._0_4_ * 0.5;
    fVar337 = auVar211._4_4_ * auVar211._4_4_ * 0.5;
    fVar339 = auVar211._8_4_ * auVar211._8_4_ * 0.5;
    fVar166 = auVar211._12_4_ * auVar211._12_4_ * 0.5;
    fVar167 = auVar211._16_4_ * auVar211._16_4_ * 0.5;
    fVar168 = auVar211._20_4_ * auVar211._20_4_ * 0.5;
    fVar263 = auVar211._24_4_ * auVar211._24_4_ * 0.5;
    auVar233 = vpermilps_avx(ZEXT416((uint)(auVar175._0_4_ * 0.04761905)),0);
    fVar130 = auVar233._0_4_;
    fVar359 = fVar130 * (fVar392 * fVar272 +
                        (float)local_240._0_4_ * fVar307 +
                        fVar253 * (float)local_4c0._0_4_ + fVar335 * (float)local_540._0_4_);
    fVar260 = auVar233._4_4_;
    fVar366 = fVar260 * (fVar393 * fVar277 +
                        (float)local_240._4_4_ * fVar261 +
                        fVar267 * (float)local_4c0._4_4_ + fVar337 * (float)local_540._4_4_);
    auVar39._4_4_ = fVar366;
    auVar39._0_4_ = fVar359;
    fVar248 = auVar233._8_4_;
    fVar367 = fVar248 * (fVar249 * fVar278 +
                        fStack_238 * fVar265 + fVar292 * fStack_4b8 + fVar339 * fStack_538);
    auVar39._8_4_ = fVar367;
    fVar271 = auVar233._12_4_;
    fVar368 = fVar271 * (auVar19._12_4_ * fVar280 +
                        fStack_234 * fVar268 + fVar301 * fStack_4b4 + fVar166 * fStack_534);
    auVar39._12_4_ = fVar368;
    fVar369 = fVar130 * (fVar392 * fVar286 +
                        fStack_230 * fVar269 + fVar304 * fStack_4b0 + fVar167 * fStack_530);
    auVar39._16_4_ = fVar369;
    fVar370 = fVar260 * (fVar393 * fVar287 +
                        fStack_22c * fVar274 + fVar264 * fStack_4ac + fVar168 * fStack_52c);
    auVar39._20_4_ = fVar370;
    fVar371 = fVar248 * (fVar249 * fVar288 +
                        fStack_228 * fVar275 + fVar250 * fStack_4a8 + fVar263 * fStack_528);
    auVar39._24_4_ = fVar371;
    auVar39._28_4_ = uStack_1c4;
    fVar344 = fVar130 * ((float)local_1e0._0_4_ * fVar272 +
                        (float)local_260._0_4_ * fVar307 +
                        fVar253 * (float)local_4e0._0_4_ + fVar335 * (float)local_560._0_4_);
    fVar352 = fVar260 * ((float)local_1e0._4_4_ * fVar277 +
                        (float)local_260._4_4_ * fVar261 +
                        fVar267 * (float)local_4e0._4_4_ + fVar337 * (float)local_560._4_4_);
    auVar38._4_4_ = fVar352;
    auVar38._0_4_ = fVar344;
    fVar353 = fVar248 * (fStack_1d8 * fVar278 +
                        fStack_258 * fVar265 + fVar292 * fStack_4d8 + fVar339 * fStack_558);
    auVar38._8_4_ = fVar353;
    fVar354 = fVar271 * (fStack_1d4 * fVar280 +
                        fStack_254 * fVar268 + fVar301 * fStack_4d4 + fVar166 * fStack_554);
    auVar38._12_4_ = fVar354;
    fVar355 = fVar130 * (fStack_1d0 * fVar286 +
                        fStack_250 * fVar269 + fVar304 * fStack_4d0 + fVar167 * fStack_550);
    auVar38._16_4_ = fVar355;
    fVar356 = fVar260 * (fStack_1cc * fVar287 +
                        fStack_24c * fVar274 + fVar264 * fStack_4cc + fVar168 * fStack_54c);
    auVar38._20_4_ = fVar356;
    fVar357 = fVar248 * (fStack_1c8 * fVar288 +
                        fStack_248 * fVar275 + fVar250 * fStack_4c8 + fVar263 * fStack_548);
    auVar38._24_4_ = fVar357;
    auVar38._28_4_ = fStack_204;
    fVar372 = fVar130 * ((float)local_200._0_4_ * fVar272 +
                        fVar335 * (float)local_580._0_4_ + fVar253 * (float)local_500._0_4_ +
                        (float)local_280._0_4_ * fVar307);
    fVar376 = fVar260 * ((float)local_200._4_4_ * fVar277 +
                        fVar337 * (float)local_580._4_4_ + fVar267 * (float)local_500._4_4_ +
                        (float)local_280._4_4_ * fVar261);
    auVar116._4_4_ = fVar376;
    auVar116._0_4_ = fVar372;
    fVar378 = fVar248 * (fStack_1f8 * fVar278 +
                        fVar339 * fStack_578 + fVar292 * fStack_4f8 + fStack_278 * fVar265);
    auVar116._8_4_ = fVar378;
    fVar380 = fVar271 * (fStack_1f4 * fVar280 +
                        fVar166 * fStack_574 + fVar301 * fStack_4f4 + fStack_274 * fVar268);
    auVar116._12_4_ = fVar380;
    fVar382 = fVar130 * (fStack_1f0 * fVar286 +
                        fVar167 * fStack_570 + fVar304 * fStack_4f0 + fStack_270 * fVar269);
    auVar116._16_4_ = fVar382;
    fVar384 = fVar260 * (fStack_1ec * fVar287 +
                        fVar168 * fStack_56c + fVar264 * fStack_4ec + fStack_26c * fVar274);
    auVar116._20_4_ = fVar384;
    fVar386 = fVar248 * (fStack_1e8 * fVar288 +
                        fVar263 * fStack_568 + fVar250 * fStack_4e8 + fStack_268 * fVar275);
    auVar116._24_4_ = fVar386;
    auVar116._28_4_ = fStack_224;
    fVar253 = fVar130 * ((float)local_220._0_4_ * fVar272 +
                        fVar307 * (float)local_4a0._0_4_ +
                        fVar335 * (float)local_5a0._0_4_ + fVar253 * (float)local_520._0_4_);
    fVar307 = fVar260 * ((float)local_220._4_4_ * fVar277 +
                        fVar261 * (float)local_4a0._4_4_ +
                        fVar337 * (float)local_5a0._4_4_ + fVar267 * (float)local_520._4_4_);
    auVar30._4_4_ = fVar307;
    auVar30._0_4_ = fVar253;
    fVar261 = fVar248 * (fStack_218 * fVar278 +
                        fVar265 * fStack_498 + fVar339 * fStack_598 + fVar292 * fStack_518);
    auVar30._8_4_ = fVar261;
    fVar272 = fVar271 * (fStack_214 * fVar280 +
                        fVar268 * fStack_494 + fVar166 * fStack_594 + fVar301 * fStack_514);
    auVar30._12_4_ = fVar272;
    fVar130 = fVar130 * (fStack_210 * fVar286 +
                        fVar269 * fStack_490 + fVar167 * fStack_590 + fVar304 * fStack_510);
    auVar30._16_4_ = fVar130;
    fVar260 = fVar260 * (fStack_20c * fVar287 +
                        fVar274 * fStack_48c + fVar168 * fStack_58c + fVar264 * fStack_50c);
    auVar30._20_4_ = fVar260;
    fVar248 = fVar248 * (fStack_208 * fVar288 +
                        fVar275 * fStack_488 + fVar263 * fStack_588 + fVar250 * fStack_508);
    auVar30._24_4_ = fVar248;
    auVar30._28_4_ = fVar271;
    auVar84._4_4_ = fVar303;
    auVar84._0_4_ = fVar294;
    auVar84._8_4_ = fVar306;
    auVar84._12_4_ = fVar309;
    auVar84._16_4_ = fVar311;
    auVar84._20_4_ = fVar313;
    auVar84._24_4_ = fVar315;
    auVar84._28_4_ = fVar317;
    auVar113 = vperm2f128_avx(auVar84,auVar84,1);
    auVar113 = vshufps_avx(auVar113,auVar84,0x30);
    local_aa0 = vshufps_avx(auVar84,auVar113,0x29);
    auVar113 = vperm2f128_avx(_local_d00,_local_d00,1);
    auVar113 = vshufps_avx(auVar113,_local_d00,0x30);
    auVar211 = vshufps_avx(_local_d00,auVar113,0x29);
    auVar33 = vsubps_avx(_local_b20,auVar30);
    auVar113 = vperm2f128_avx(auVar33,auVar33,1);
    auVar113 = vshufps_avx(auVar113,auVar33,0x30);
    auVar30 = vshufps_avx(auVar33,auVar113,0x29);
    local_5e0 = vsubps_avx(local_aa0,auVar84);
    local_2e0 = vsubps_avx(auVar211,_local_d00);
    fVar337 = local_5e0._0_4_;
    fVar263 = local_5e0._4_4_;
    auVar31._4_4_ = fVar376 * fVar263;
    auVar31._0_4_ = fVar372 * fVar337;
    fVar264 = local_5e0._8_4_;
    auVar31._8_4_ = fVar378 * fVar264;
    fVar275 = local_5e0._12_4_;
    auVar31._12_4_ = fVar380 * fVar275;
    fVar290 = local_5e0._16_4_;
    auVar31._16_4_ = fVar382 * fVar290;
    fVar314 = local_5e0._20_4_;
    auVar31._20_4_ = fVar384 * fVar314;
    fVar20 = local_5e0._24_4_;
    auVar31._24_4_ = fVar386 * fVar20;
    auVar31._28_4_ = auVar33._28_4_;
    fVar339 = local_2e0._0_4_;
    fVar267 = local_2e0._4_4_;
    auVar35._4_4_ = fVar352 * fVar267;
    auVar35._0_4_ = fVar344 * fVar339;
    fVar250 = local_2e0._8_4_;
    auVar35._8_4_ = fVar353 * fVar250;
    fVar277 = local_2e0._12_4_;
    auVar35._12_4_ = fVar354 * fVar277;
    fVar291 = local_2e0._16_4_;
    auVar35._16_4_ = fVar355 * fVar291;
    fVar316 = local_2e0._20_4_;
    auVar35._20_4_ = fVar356 * fVar316;
    fVar21 = local_2e0._24_4_;
    auVar35._24_4_ = fVar357 * fVar21;
    auVar35._28_4_ = auVar113._28_4_;
    auVar34 = vsubps_avx(auVar35,auVar31);
    auVar88._4_4_ = fStack_a1c;
    auVar88._0_4_ = local_a20;
    auVar88._8_4_ = fStack_a18;
    auVar88._12_4_ = fStack_a14;
    auVar88._16_4_ = fStack_a10;
    auVar88._20_4_ = fStack_a0c;
    auVar88._24_4_ = fStack_a08;
    auVar88._28_4_ = fStack_a04;
    auVar113 = vperm2f128_avx(auVar88,auVar88,1);
    auVar113 = vshufps_avx(auVar113,auVar88,0x30);
    auVar31 = vshufps_avx(auVar88,auVar113,0x29);
    local_600 = vsubps_avx(auVar31,auVar88);
    auVar36._4_4_ = fVar366 * fVar267;
    auVar36._0_4_ = fVar359 * fVar339;
    auVar36._8_4_ = fVar367 * fVar250;
    auVar36._12_4_ = fVar368 * fVar277;
    auVar36._16_4_ = fVar369 * fVar291;
    auVar36._20_4_ = fVar370 * fVar316;
    auVar36._24_4_ = fVar371 * fVar21;
    auVar36._28_4_ = auVar113._28_4_;
    fVar166 = local_600._0_4_;
    fVar292 = local_600._4_4_;
    auVar37._4_4_ = fVar376 * fVar292;
    auVar37._0_4_ = fVar372 * fVar166;
    fVar265 = local_600._8_4_;
    auVar37._8_4_ = fVar378 * fVar265;
    fVar278 = local_600._12_4_;
    auVar37._12_4_ = fVar380 * fVar278;
    fVar293 = local_600._16_4_;
    auVar37._16_4_ = fVar382 * fVar293;
    fVar326 = local_600._20_4_;
    auVar37._20_4_ = fVar384 * fVar326;
    fVar22 = local_600._24_4_;
    auVar37._24_4_ = fVar386 * fVar22;
    auVar37._28_4_ = fVar327;
    auVar35 = vsubps_avx(auVar37,auVar36);
    auVar389._4_4_ = fVar352 * fVar292;
    auVar389._0_4_ = fVar344 * fVar166;
    auVar389._8_4_ = fVar353 * fVar265;
    auVar389._12_4_ = fVar354 * fVar278;
    auVar389._16_4_ = fVar355 * fVar293;
    auVar389._20_4_ = fVar356 * fVar326;
    auVar389._24_4_ = fVar357 * fVar22;
    auVar389._28_4_ = fVar327;
    auVar32._4_4_ = fVar366 * fVar263;
    auVar32._0_4_ = fVar359 * fVar337;
    auVar32._8_4_ = fVar367 * fVar264;
    auVar32._12_4_ = fVar368 * fVar275;
    auVar32._16_4_ = fVar369 * fVar290;
    auVar32._20_4_ = fVar370 * fVar314;
    auVar32._24_4_ = fVar371 * fVar20;
    auVar32._28_4_ = uStack_1e4;
    auVar36 = vsubps_avx(auVar32,auVar389);
    fVar335 = auVar36._28_4_;
    auVar187._0_4_ = fVar166 * fVar166 + fVar337 * fVar337 + fVar339 * fVar339;
    auVar187._4_4_ = fVar292 * fVar292 + fVar263 * fVar263 + fVar267 * fVar267;
    auVar187._8_4_ = fVar265 * fVar265 + fVar264 * fVar264 + fVar250 * fVar250;
    auVar187._12_4_ = fVar278 * fVar278 + fVar275 * fVar275 + fVar277 * fVar277;
    auVar187._16_4_ = fVar293 * fVar293 + fVar290 * fVar290 + fVar291 * fVar291;
    auVar187._20_4_ = fVar326 * fVar326 + fVar314 * fVar314 + fVar316 * fVar316;
    auVar187._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar187._28_4_ = fVar335 + fVar335 + auVar34._28_4_;
    auVar113 = vrcpps_avx(auVar187);
    fVar274 = auVar113._0_4_;
    fVar287 = auVar113._4_4_;
    auVar40._4_4_ = fVar287 * auVar187._4_4_;
    auVar40._0_4_ = fVar274 * auVar187._0_4_;
    fVar288 = auVar113._8_4_;
    auVar40._8_4_ = fVar288 * auVar187._8_4_;
    fVar289 = auVar113._12_4_;
    auVar40._12_4_ = fVar289 * auVar187._12_4_;
    fVar308 = auVar113._16_4_;
    auVar40._16_4_ = fVar308 * auVar187._16_4_;
    fVar310 = auVar113._20_4_;
    auVar40._20_4_ = fVar310 * auVar187._20_4_;
    fVar312 = auVar113._24_4_;
    auVar40._24_4_ = fVar312 * auVar187._24_4_;
    auVar40._28_4_ = uStack_1e4;
    auVar150._8_4_ = 0x3f800000;
    auVar150._0_8_ = 0x3f8000003f800000;
    auVar150._12_4_ = 0x3f800000;
    auVar150._16_4_ = 0x3f800000;
    auVar150._20_4_ = 0x3f800000;
    auVar150._24_4_ = 0x3f800000;
    auVar150._28_4_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar150,auVar40);
    fVar274 = fVar274 + fVar274 * auVar37._0_4_;
    fVar287 = fVar287 + fVar287 * auVar37._4_4_;
    fVar288 = fVar288 + fVar288 * auVar37._8_4_;
    fVar289 = fVar289 + fVar289 * auVar37._12_4_;
    fVar308 = fVar308 + fVar308 * auVar37._16_4_;
    fVar310 = fVar310 + fVar310 * auVar37._20_4_;
    fVar312 = fVar312 + fVar312 * auVar37._24_4_;
    auVar33 = vperm2f128_avx(auVar38,auVar38,1);
    auVar33 = vshufps_avx(auVar33,auVar38,0x30);
    local_a80 = vshufps_avx(auVar38,auVar33,0x29);
    auVar33 = vperm2f128_avx(auVar116,auVar116,1);
    auVar33 = vshufps_avx(auVar33,auVar116,0x30);
    local_960 = vshufps_avx(auVar116,auVar33,0x29);
    fVar373 = local_960._0_4_;
    fVar377 = local_960._4_4_;
    auVar41._4_4_ = fVar377 * fVar263;
    auVar41._0_4_ = fVar373 * fVar337;
    fVar379 = local_960._8_4_;
    auVar41._8_4_ = fVar379 * fVar264;
    fVar381 = local_960._12_4_;
    auVar41._12_4_ = fVar381 * fVar275;
    fVar383 = local_960._16_4_;
    auVar41._16_4_ = fVar383 * fVar290;
    fVar385 = local_960._20_4_;
    auVar41._20_4_ = fVar385 * fVar314;
    fVar387 = local_960._24_4_;
    auVar41._24_4_ = fVar387 * fVar20;
    auVar41._28_4_ = auVar33._28_4_;
    fVar167 = local_a80._0_4_;
    fVar301 = local_a80._4_4_;
    auVar42._4_4_ = fVar267 * fVar301;
    auVar42._0_4_ = fVar339 * fVar167;
    fVar268 = local_a80._8_4_;
    auVar42._8_4_ = fVar250 * fVar268;
    fVar280 = local_a80._12_4_;
    auVar42._12_4_ = fVar277 * fVar280;
    fVar302 = local_a80._16_4_;
    auVar42._16_4_ = fVar291 * fVar302;
    fVar327 = local_a80._20_4_;
    auVar42._20_4_ = fVar316 * fVar327;
    fVar23 = local_a80._24_4_;
    auVar42._24_4_ = fVar21 * fVar23;
    auVar42._28_4_ = fStack_204;
    auVar38 = vsubps_avx(auVar42,auVar41);
    auVar33 = vperm2f128_avx(auVar39,auVar39,1);
    auVar33 = vshufps_avx(auVar33,auVar39,0x30);
    local_940 = vshufps_avx(auVar39,auVar33,0x29);
    fVar168 = local_940._0_4_;
    fVar304 = local_940._4_4_;
    auVar43._4_4_ = fVar267 * fVar304;
    auVar43._0_4_ = fVar339 * fVar168;
    fVar269 = local_940._8_4_;
    auVar43._8_4_ = fVar250 * fVar269;
    fVar286 = local_940._12_4_;
    auVar43._12_4_ = fVar277 * fVar286;
    fVar305 = local_940._16_4_;
    auVar43._16_4_ = fVar291 * fVar305;
    fVar358 = local_940._20_4_;
    auVar43._20_4_ = fVar316 * fVar358;
    fVar24 = local_940._24_4_;
    auVar43._24_4_ = fVar21 * fVar24;
    auVar43._28_4_ = auVar33._28_4_;
    auVar44._4_4_ = fVar377 * fVar292;
    auVar44._0_4_ = fVar373 * fVar166;
    auVar44._8_4_ = fVar379 * fVar265;
    auVar44._12_4_ = fVar381 * fVar278;
    auVar44._16_4_ = fVar383 * fVar293;
    auVar44._20_4_ = fVar385 * fVar326;
    auVar44._24_4_ = fVar387 * fVar22;
    auVar44._28_4_ = uStack_1c4;
    auVar33 = vsubps_avx(auVar44,auVar43);
    auVar45._4_4_ = fVar292 * fVar301;
    auVar45._0_4_ = fVar166 * fVar167;
    auVar45._8_4_ = fVar265 * fVar268;
    auVar45._12_4_ = fVar278 * fVar280;
    auVar45._16_4_ = fVar293 * fVar302;
    auVar45._20_4_ = fVar326 * fVar327;
    auVar45._24_4_ = fVar22 * fVar23;
    auVar45._28_4_ = uStack_1c4;
    auVar47._4_4_ = fVar304 * fVar263;
    auVar47._0_4_ = fVar168 * fVar337;
    auVar47._8_4_ = fVar269 * fVar264;
    auVar47._12_4_ = fVar286 * fVar275;
    auVar47._16_4_ = fVar305 * fVar290;
    auVar47._20_4_ = fVar358 * fVar314;
    fVar46 = local_960._28_4_;
    auVar47._24_4_ = fVar24 * fVar20;
    auVar47._28_4_ = fVar46;
    auVar116 = vsubps_avx(auVar47,auVar45);
    auVar48._4_4_ =
         fVar287 * (auVar34._4_4_ * auVar34._4_4_ +
                   auVar36._4_4_ * auVar36._4_4_ + auVar35._4_4_ * auVar35._4_4_);
    auVar48._0_4_ =
         fVar274 * (auVar34._0_4_ * auVar34._0_4_ +
                   auVar36._0_4_ * auVar36._0_4_ + auVar35._0_4_ * auVar35._0_4_);
    auVar48._8_4_ =
         fVar288 * (auVar34._8_4_ * auVar34._8_4_ +
                   auVar36._8_4_ * auVar36._8_4_ + auVar35._8_4_ * auVar35._8_4_);
    auVar48._12_4_ =
         fVar289 * (auVar34._12_4_ * auVar34._12_4_ +
                   auVar36._12_4_ * auVar36._12_4_ + auVar35._12_4_ * auVar35._12_4_);
    auVar48._16_4_ =
         fVar308 * (auVar34._16_4_ * auVar34._16_4_ +
                   auVar36._16_4_ * auVar36._16_4_ + auVar35._16_4_ * auVar35._16_4_);
    auVar48._20_4_ =
         fVar310 * (auVar34._20_4_ * auVar34._20_4_ +
                   auVar36._20_4_ * auVar36._20_4_ + auVar35._20_4_ * auVar35._20_4_);
    auVar48._24_4_ =
         fVar312 * (auVar34._24_4_ * auVar34._24_4_ +
                   auVar36._24_4_ * auVar36._24_4_ + auVar35._24_4_ * auVar35._24_4_);
    auVar48._28_4_ = auVar34._28_4_ + fVar335 + auVar35._28_4_;
    auVar49._4_4_ =
         (auVar38._4_4_ * auVar38._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar116._4_4_ * auVar116._4_4_) * fVar287;
    auVar49._0_4_ =
         (auVar38._0_4_ * auVar38._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar116._0_4_ * auVar116._0_4_) * fVar274;
    auVar49._8_4_ =
         (auVar38._8_4_ * auVar38._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar116._8_4_ * auVar116._8_4_) * fVar288;
    auVar49._12_4_ =
         (auVar38._12_4_ * auVar38._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar116._12_4_ * auVar116._12_4_) * fVar289;
    auVar49._16_4_ =
         (auVar38._16_4_ * auVar38._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar116._16_4_ * auVar116._16_4_) * fVar308;
    auVar49._20_4_ =
         (auVar38._20_4_ * auVar38._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar116._20_4_ * auVar116._20_4_) * fVar310;
    auVar49._24_4_ =
         (auVar38._24_4_ * auVar38._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar116._24_4_ * auVar116._24_4_) * fVar312;
    auVar49._28_4_ = auVar113._28_4_ + auVar37._28_4_;
    auVar113 = vmaxps_avx(auVar48,auVar49);
    auVar33 = vperm2f128_avx(_local_b20,_local_b20,1);
    auVar33 = vshufps_avx(auVar33,_local_b20,0x30);
    auVar35 = vshufps_avx(_local_b20,auVar33,0x29);
    auVar114._0_4_ = (float)local_b20._0_4_ + fVar253;
    auVar114._4_4_ = (float)local_b20._4_4_ + fVar307;
    auVar114._8_4_ = fStack_b18 + fVar261;
    auVar114._12_4_ = fStack_b14 + fVar272;
    auVar114._16_4_ = fStack_b10 + fVar130;
    auVar114._20_4_ = fStack_b0c + fVar260;
    auVar114._24_4_ = fStack_b08 + fVar248;
    auVar114._28_4_ = fStack_b04 + fVar271;
    auVar33 = vmaxps_avx(_local_b20,auVar114);
    auVar34 = vmaxps_avx(auVar30,auVar35);
    auVar33 = vmaxps_avx(auVar33,auVar34);
    auVar34 = vrsqrtps_avx(auVar187);
    fVar335 = auVar34._0_4_;
    fVar130 = auVar34._4_4_;
    fVar253 = auVar34._8_4_;
    fVar260 = auVar34._12_4_;
    fVar307 = auVar34._16_4_;
    fVar248 = auVar34._20_4_;
    fVar261 = auVar34._24_4_;
    auVar50._4_4_ = fVar130 * fVar130 * fVar130 * auVar187._4_4_ * 0.5;
    auVar50._0_4_ = fVar335 * fVar335 * fVar335 * auVar187._0_4_ * 0.5;
    auVar50._8_4_ = fVar253 * fVar253 * fVar253 * auVar187._8_4_ * 0.5;
    auVar50._12_4_ = fVar260 * fVar260 * fVar260 * auVar187._12_4_ * 0.5;
    auVar50._16_4_ = fVar307 * fVar307 * fVar307 * auVar187._16_4_ * 0.5;
    auVar50._20_4_ = fVar248 * fVar248 * fVar248 * auVar187._20_4_ * 0.5;
    auVar50._24_4_ = fVar261 * fVar261 * fVar261 * auVar187._24_4_ * 0.5;
    auVar50._28_4_ = auVar187._28_4_;
    auVar51._4_4_ = fVar130 * 1.5;
    auVar51._0_4_ = fVar335 * 1.5;
    auVar51._8_4_ = fVar253 * 1.5;
    auVar51._12_4_ = fVar260 * 1.5;
    auVar51._16_4_ = fVar307 * 1.5;
    auVar51._20_4_ = fVar248 * 1.5;
    auVar51._24_4_ = fVar261 * 1.5;
    auVar51._28_4_ = auVar34._28_4_;
    local_680 = vsubps_avx(auVar51,auVar50);
    auVar85._4_4_ = fVar303;
    auVar85._0_4_ = fVar294;
    auVar85._8_4_ = fVar306;
    auVar85._12_4_ = fVar309;
    auVar85._16_4_ = fVar311;
    auVar85._20_4_ = fVar313;
    auVar85._24_4_ = fVar315;
    auVar85._28_4_ = fVar317;
    local_980 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    auVar36 = vsubps_avx(ZEXT832(0) << 0x20,_local_d00);
    auVar334 = ZEXT3264(auVar36);
    fVar329 = auVar36._0_4_;
    fVar336 = auVar36._4_4_;
    fVar338 = auVar36._8_4_;
    fVar340 = auVar36._12_4_;
    fVar341 = auVar36._16_4_;
    fVar342 = auVar36._20_4_;
    fVar343 = auVar36._24_4_;
    fVar130 = local_980._0_4_;
    fVar307 = local_980._4_4_;
    fVar271 = local_980._8_4_;
    fVar287 = local_980._12_4_;
    fVar308 = local_980._16_4_;
    fVar392 = local_980._20_4_;
    fVar25 = local_980._24_4_;
    auVar389 = ZEXT832(0) << 0x20;
    auVar36 = vsubps_avx(auVar389,auVar88);
    fVar253 = auVar36._0_4_;
    fVar248 = auVar36._4_4_;
    fVar272 = auVar36._8_4_;
    fVar288 = auVar36._12_4_;
    fVar310 = auVar36._16_4_;
    fVar393 = auVar36._20_4_;
    fVar26 = auVar36._24_4_;
    auVar320._0_4_ =
         (float)local_8e0._0_4_ * fVar253 +
         (float)local_900._0_4_ * fVar130 + fVar329 * (float)local_920._0_4_;
    auVar320._4_4_ =
         (float)local_8e0._4_4_ * fVar248 +
         (float)local_900._4_4_ * fVar307 + fVar336 * (float)local_920._4_4_;
    auVar320._8_4_ = fStack_8d8 * fVar272 + fStack_8f8 * fVar271 + fVar338 * fStack_918;
    auVar320._12_4_ = fStack_8d4 * fVar288 + fStack_8f4 * fVar287 + fVar340 * fStack_914;
    auVar320._16_4_ = fStack_8d0 * fVar310 + fStack_8f0 * fVar308 + fVar341 * fStack_910;
    auVar320._20_4_ = fStack_8cc * fVar393 + fStack_8ec * fVar392 + fVar342 * fStack_90c;
    auVar320._24_4_ = fStack_8c8 * fVar26 + fStack_8e8 * fVar25 + fVar343 * fStack_908;
    auVar320._28_4_ = auVar116._28_4_ + auVar34._28_4_ + auVar187._28_4_;
    auVar363._0_4_ = fVar253 * fVar253 + fVar130 * fVar130 + fVar329 * fVar329;
    auVar363._4_4_ = fVar248 * fVar248 + fVar307 * fVar307 + fVar336 * fVar336;
    auVar363._8_4_ = fVar272 * fVar272 + fVar271 * fVar271 + fVar338 * fVar338;
    auVar363._12_4_ = fVar288 * fVar288 + fVar287 * fVar287 + fVar340 * fVar340;
    auVar363._16_4_ = fVar310 * fVar310 + fVar308 * fVar308 + fVar341 * fVar341;
    auVar363._20_4_ = fVar393 * fVar393 + fVar392 * fVar392 + fVar342 * fVar342;
    auVar363._24_4_ = fVar26 * fVar26 + fVar25 * fVar25 + fVar343 * fVar343;
    auVar363._28_4_ = fVar46 + fVar46 + auVar116._28_4_;
    fVar260 = local_680._0_4_;
    fVar261 = local_680._4_4_;
    fVar274 = local_680._8_4_;
    fVar289 = local_680._12_4_;
    fVar312 = local_680._16_4_;
    fVar249 = local_680._20_4_;
    fVar251 = local_680._24_4_;
    local_6a0 = (float)local_8e0._0_4_ * fVar166 * fVar260 +
                fVar337 * fVar260 * (float)local_900._0_4_ +
                fVar339 * fVar260 * (float)local_920._0_4_;
    fStack_69c = (float)local_8e0._4_4_ * fVar292 * fVar261 +
                 fVar263 * fVar261 * (float)local_900._4_4_ +
                 fVar267 * fVar261 * (float)local_920._4_4_;
    fStack_698 = fStack_8d8 * fVar265 * fVar274 +
                 fVar264 * fVar274 * fStack_8f8 + fVar250 * fVar274 * fStack_918;
    fStack_694 = fStack_8d4 * fVar278 * fVar289 +
                 fVar275 * fVar289 * fStack_8f4 + fVar277 * fVar289 * fStack_914;
    fStack_690 = fStack_8d0 * fVar293 * fVar312 +
                 fVar290 * fVar312 * fStack_8f0 + fVar291 * fVar312 * fStack_910;
    fStack_68c = fStack_8cc * fVar326 * fVar249 +
                 fVar314 * fVar249 * fStack_8ec + fVar316 * fVar249 * fStack_90c;
    fStack_688 = fStack_8c8 * fVar22 * fVar251 +
                 fVar20 * fVar251 * fStack_8e8 + fVar21 * fVar251 * fStack_908;
    fStack_684 = fStack_8c4 + fStack_8e4 + fStack_904;
    fVar335 = fStack_8c4 + fStack_8e4 + fStack_904;
    local_6c0._0_4_ =
         fVar253 * fVar166 * fVar260 + fVar337 * fVar260 * fVar130 + fVar329 * fVar339 * fVar260;
    local_6c0._4_4_ =
         fVar248 * fVar292 * fVar261 + fVar263 * fVar261 * fVar307 + fVar336 * fVar267 * fVar261;
    local_6c0._8_4_ =
         fVar272 * fVar265 * fVar274 + fVar264 * fVar274 * fVar271 + fVar338 * fVar250 * fVar274;
    local_6c0._12_4_ =
         fVar288 * fVar278 * fVar289 + fVar275 * fVar289 * fVar287 + fVar340 * fVar277 * fVar289;
    local_6c0._16_4_ =
         fVar310 * fVar293 * fVar312 + fVar290 * fVar312 * fVar308 + fVar341 * fVar291 * fVar312;
    local_6c0._20_4_ =
         fVar393 * fVar326 * fVar249 + fVar314 * fVar249 * fVar392 + fVar342 * fVar316 * fVar249;
    local_6c0._24_4_ =
         fVar26 * fVar22 * fVar251 + fVar20 * fVar251 * fVar25 + fVar343 * fVar21 * fVar251;
    local_6c0._28_4_ = fStack_8e4 + fVar335;
    auVar52._4_4_ = fStack_69c * local_6c0._4_4_;
    auVar52._0_4_ = local_6a0 * local_6c0._0_4_;
    auVar52._8_4_ = fStack_698 * local_6c0._8_4_;
    auVar52._12_4_ = fStack_694 * local_6c0._12_4_;
    auVar52._16_4_ = fStack_690 * local_6c0._16_4_;
    auVar52._20_4_ = fStack_68c * local_6c0._20_4_;
    auVar52._24_4_ = fStack_688 * local_6c0._24_4_;
    auVar52._28_4_ = fVar335;
    auVar34 = vsubps_avx(auVar320,auVar52);
    auVar53._4_4_ = local_6c0._4_4_ * local_6c0._4_4_;
    auVar53._0_4_ = local_6c0._0_4_ * local_6c0._0_4_;
    auVar53._8_4_ = local_6c0._8_4_ * local_6c0._8_4_;
    auVar53._12_4_ = local_6c0._12_4_ * local_6c0._12_4_;
    auVar53._16_4_ = local_6c0._16_4_ * local_6c0._16_4_;
    auVar53._20_4_ = local_6c0._20_4_ * local_6c0._20_4_;
    auVar53._24_4_ = local_6c0._24_4_ * local_6c0._24_4_;
    auVar53._28_4_ = fStack_8e4;
    auVar37 = vsubps_avx(auVar363,auVar53);
    local_2c0 = vsqrtps_avx(auVar113);
    local_cc0._0_4_ = auVar33._0_4_;
    local_cc0._4_4_ = auVar33._4_4_;
    fStack_cb8 = auVar33._8_4_;
    fStack_cb4 = auVar33._12_4_;
    fStack_cb0 = auVar33._16_4_;
    fStack_cac = auVar33._20_4_;
    fStack_ca8 = auVar33._24_4_;
    fStack_ca4 = auVar33._28_4_;
    fVar335 = (local_2c0._0_4_ + (float)local_cc0._0_4_) * 1.0000002;
    fVar126 = (local_2c0._4_4_ + (float)local_cc0._4_4_) * 1.0000002;
    fVar127 = (local_2c0._8_4_ + fStack_cb8) * 1.0000002;
    fVar128 = (local_2c0._12_4_ + fStack_cb4) * 1.0000002;
    fVar131 = (local_2c0._16_4_ + fStack_cb0) * 1.0000002;
    fVar133 = (local_2c0._20_4_ + fStack_cac) * 1.0000002;
    fVar135 = (local_2c0._24_4_ + fStack_ca8) * 1.0000002;
    auVar54._4_4_ = fVar126 * fVar126;
    auVar54._0_4_ = fVar335 * fVar335;
    auVar54._8_4_ = fVar127 * fVar127;
    auVar54._12_4_ = fVar128 * fVar128;
    auVar54._16_4_ = fVar131 * fVar131;
    auVar54._20_4_ = fVar133 * fVar133;
    auVar54._24_4_ = fVar135 * fVar135;
    auVar54._28_4_ = local_2c0._28_4_ + fStack_ca4;
    local_3c0._0_4_ = auVar34._0_4_ + auVar34._0_4_;
    local_3c0._4_4_ = auVar34._4_4_ + auVar34._4_4_;
    local_3c0._8_4_ = auVar34._8_4_ + auVar34._8_4_;
    local_3c0._12_4_ = auVar34._12_4_ + auVar34._12_4_;
    local_3c0._16_4_ = auVar34._16_4_ + auVar34._16_4_;
    local_3c0._20_4_ = auVar34._20_4_ + auVar34._20_4_;
    local_3c0._24_4_ = auVar34._24_4_ + auVar34._24_4_;
    fVar335 = auVar34._28_4_;
    local_3c0._28_4_ = fVar335 + fVar335;
    auVar33 = vsubps_avx(auVar37,auVar54);
    auVar55._4_4_ = fStack_69c * fStack_69c;
    auVar55._0_4_ = local_6a0 * local_6a0;
    auVar55._8_4_ = fStack_698 * fStack_698;
    auVar55._12_4_ = fStack_694 * fStack_694;
    auVar55._16_4_ = fStack_690 * fStack_690;
    auVar55._20_4_ = fStack_68c * fStack_68c;
    auVar55._24_4_ = fStack_688 * fStack_688;
    auVar55._28_4_ = fVar335;
    auVar34 = vsubps_avx(local_2a0,auVar55);
    auVar56._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    auVar56._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    auVar56._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar56._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar56._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar56._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar56._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar56._28_4_ = 0x3f800002;
    fVar335 = auVar34._0_4_;
    fVar126 = auVar34._4_4_;
    fVar127 = auVar34._8_4_;
    fVar128 = auVar34._12_4_;
    fVar131 = auVar34._16_4_;
    fStack_890 = fVar131 * 4.0;
    fVar133 = auVar34._20_4_;
    fStack_88c = fVar133 * 4.0;
    fVar135 = auVar34._24_4_;
    fStack_888 = fVar135 * 4.0;
    uStack_884 = 0x40800000;
    auVar57._4_4_ = auVar33._4_4_ * fVar126 * 4.0;
    auVar57._0_4_ = auVar33._0_4_ * fVar335 * 4.0;
    auVar57._8_4_ = auVar33._8_4_ * fVar127 * 4.0;
    auVar57._12_4_ = auVar33._12_4_ * fVar128 * 4.0;
    auVar57._16_4_ = auVar33._16_4_ * fStack_890;
    auVar57._20_4_ = auVar33._20_4_ * fStack_88c;
    auVar57._24_4_ = auVar33._24_4_ * fStack_888;
    auVar57._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(auVar56,auVar57);
    auVar113 = vcmpps_avx(auVar38,auVar389,5);
    auVar223._8_4_ = 0x7fffffff;
    auVar223._0_8_ = 0x7fffffff7fffffff;
    auVar223._12_4_ = 0x7fffffff;
    auVar223._16_4_ = 0x7fffffff;
    auVar223._20_4_ = 0x7fffffff;
    auVar223._24_4_ = 0x7fffffff;
    auVar223._28_4_ = 0x7fffffff;
    local_300 = vandps_avx(auVar55,auVar223);
    local_320._0_4_ = fVar335 + fVar335;
    local_320._4_4_ = fVar126 + fVar126;
    local_320._8_4_ = fVar127 + fVar127;
    local_320._12_4_ = fVar128 + fVar128;
    local_320._16_4_ = fVar131 + fVar131;
    local_320._20_4_ = fVar133 + fVar133;
    local_320._24_4_ = fVar135 + fVar135;
    local_320._28_4_ = auVar34._28_4_ + auVar34._28_4_;
    local_3a0 = vandps_avx(auVar34,auVar223);
    uVar94 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_a40._0_8_ = uVar94 ^ 0x8000000080000000;
    local_a40._8_4_ = -local_3c0._8_4_;
    local_a40._12_4_ = -local_3c0._12_4_;
    local_a40._16_4_ = -local_3c0._16_4_;
    local_a40._20_4_ = -local_3c0._20_4_;
    local_a40._24_4_ = -local_3c0._24_4_;
    local_a40._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0x7f,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar113 >> 0xbf,0) == '\0') &&
        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar113[0x1f])
    {
      auVar151._8_4_ = 0x7f800000;
      auVar151._0_8_ = 0x7f8000007f800000;
      auVar151._12_4_ = 0x7f800000;
      auVar151._16_4_ = 0x7f800000;
      auVar151._20_4_ = 0x7f800000;
      auVar151._24_4_ = 0x7f800000;
      auVar151._28_4_ = 0x7f800000;
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      local_9c0 = local_2a0;
    }
    else {
      auVar32 = vsqrtps_avx(auVar38);
      auVar116 = vrcpps_avx(local_320);
      auVar34 = vcmpps_avx(auVar38,auVar389,5);
      fVar131 = auVar116._0_4_;
      fVar133 = auVar116._4_4_;
      auVar58._4_4_ = local_320._4_4_ * fVar133;
      auVar58._0_4_ = local_320._0_4_ * fVar131;
      fVar135 = auVar116._8_4_;
      auVar58._8_4_ = local_320._8_4_ * fVar135;
      fVar129 = auVar116._12_4_;
      auVar58._12_4_ = local_320._12_4_ * fVar129;
      fVar132 = auVar116._16_4_;
      auVar58._16_4_ = local_320._16_4_ * fVar132;
      fVar134 = auVar116._20_4_;
      auVar58._20_4_ = local_320._20_4_ * fVar134;
      fVar136 = auVar116._24_4_;
      auVar58._24_4_ = local_320._24_4_ * fVar136;
      auVar58._28_4_ = auVar38._28_4_;
      auVar224._8_4_ = 0x3f800000;
      auVar224._0_8_ = 0x3f8000003f800000;
      auVar224._12_4_ = 0x3f800000;
      auVar224._16_4_ = 0x3f800000;
      auVar224._20_4_ = 0x3f800000;
      auVar224._24_4_ = 0x3f800000;
      auVar224._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar224,auVar58);
      fVar131 = fVar131 + fVar131 * auVar38._0_4_;
      fVar133 = fVar133 + fVar133 * auVar38._4_4_;
      fVar135 = fVar135 + fVar135 * auVar38._8_4_;
      fVar129 = fVar129 + fVar129 * auVar38._12_4_;
      fVar132 = fVar132 + fVar132 * auVar38._16_4_;
      fVar134 = fVar134 + fVar134 * auVar38._20_4_;
      fVar136 = fVar136 + fVar136 * auVar38._24_4_;
      auVar389 = vsubps_avx(local_a40,auVar32);
      fVar252 = auVar389._0_4_ * fVar131;
      fVar262 = auVar389._4_4_ * fVar133;
      auVar59._4_4_ = fVar262;
      auVar59._0_4_ = fVar252;
      fVar266 = auVar389._8_4_ * fVar135;
      auVar59._8_4_ = fVar266;
      fVar270 = auVar389._12_4_ * fVar129;
      auVar59._12_4_ = fVar270;
      fVar273 = auVar389._16_4_ * fVar132;
      auVar59._16_4_ = fVar273;
      fVar276 = auVar389._20_4_ * fVar134;
      auVar59._20_4_ = fVar276;
      fVar279 = auVar389._24_4_ * fVar136;
      auVar59._24_4_ = fVar279;
      auVar59._28_4_ = auVar389._28_4_;
      auVar389 = vsubps_avx(auVar32,local_3c0);
      fVar131 = auVar389._0_4_ * fVar131;
      fVar133 = auVar389._4_4_ * fVar133;
      auVar60._4_4_ = fVar133;
      auVar60._0_4_ = fVar131;
      fVar135 = auVar389._8_4_ * fVar135;
      auVar60._8_4_ = fVar135;
      fVar129 = auVar389._12_4_ * fVar129;
      auVar60._12_4_ = fVar129;
      fVar132 = auVar389._16_4_ * fVar132;
      auVar60._16_4_ = fVar132;
      fVar134 = auVar389._20_4_ * fVar134;
      auVar60._20_4_ = fVar134;
      fVar136 = auVar389._24_4_ * fVar136;
      auVar60._24_4_ = fVar136;
      auVar60._28_4_ = auVar116._28_4_ + auVar38._28_4_;
      local_360 = fVar260 * (local_6c0._0_4_ + local_6a0 * fVar252);
      fStack_35c = fVar261 * (local_6c0._4_4_ + fStack_69c * fVar262);
      fStack_358 = fVar274 * (local_6c0._8_4_ + fStack_698 * fVar266);
      fStack_354 = fVar289 * (local_6c0._12_4_ + fStack_694 * fVar270);
      fStack_350 = fVar312 * (local_6c0._16_4_ + fStack_690 * fVar273);
      fStack_34c = fVar249 * (local_6c0._20_4_ + fStack_68c * fVar276);
      fStack_348 = fVar251 * (local_6c0._24_4_ + fStack_688 * fVar279);
      fStack_344 = local_320._28_4_;
      local_380 = fVar260 * (local_6c0._0_4_ + local_6a0 * fVar131);
      fStack_37c = fVar261 * (local_6c0._4_4_ + fStack_69c * fVar133);
      fStack_378 = fVar274 * (local_6c0._8_4_ + fStack_698 * fVar135);
      fStack_374 = fVar289 * (local_6c0._12_4_ + fStack_694 * fVar129);
      fStack_370 = fVar312 * (local_6c0._16_4_ + fStack_690 * fVar132);
      fStack_36c = fVar249 * (local_6c0._20_4_ + fStack_68c * fVar134);
      fStack_368 = fVar251 * (local_6c0._24_4_ + fStack_688 * fVar136);
      fStack_364 = local_320._28_4_;
      auVar240._8_4_ = 0x7f800000;
      auVar240._0_8_ = 0x7f8000007f800000;
      auVar240._12_4_ = 0x7f800000;
      auVar240._16_4_ = 0x7f800000;
      auVar240._20_4_ = 0x7f800000;
      auVar240._24_4_ = 0x7f800000;
      auVar240._28_4_ = 0x7f800000;
      auVar151 = vblendvps_avx(auVar240,auVar59,auVar34);
      auVar241._8_4_ = 0xff800000;
      auVar241._0_8_ = 0xff800000ff800000;
      auVar241._12_4_ = 0xff800000;
      auVar241._16_4_ = 0xff800000;
      auVar241._20_4_ = 0xff800000;
      auVar241._24_4_ = 0xff800000;
      auVar241._28_4_ = 0xff800000;
      auVar115 = vblendvps_avx(auVar241,auVar60,auVar34);
      auVar38 = vmaxps_avx(local_620,local_300);
      auVar61._4_4_ = auVar38._4_4_ * 1.9073486e-06;
      auVar61._0_4_ = auVar38._0_4_ * 1.9073486e-06;
      auVar61._8_4_ = auVar38._8_4_ * 1.9073486e-06;
      auVar61._12_4_ = auVar38._12_4_ * 1.9073486e-06;
      auVar61._16_4_ = auVar38._16_4_ * 1.9073486e-06;
      auVar61._20_4_ = auVar38._20_4_ * 1.9073486e-06;
      auVar61._24_4_ = auVar38._24_4_ * 1.9073486e-06;
      auVar61._28_4_ = auVar38._28_4_;
      auVar38 = vcmpps_avx(local_3a0,auVar61,1);
      auVar116 = auVar34 & auVar38;
      local_9c0 = local_a40;
      if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar116 >> 0x7f,0) != '\0') ||
            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar116 >> 0xbf,0) != '\0') ||
          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar116[0x1f] < '\0') {
        auVar113 = vandps_avx(auVar38,auVar34);
        auVar233 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar38 = vcmpps_avx(auVar33,_DAT_01f7b000,2);
        auVar324._8_4_ = 0xff800000;
        auVar324._0_8_ = 0xff800000ff800000;
        auVar324._12_4_ = 0xff800000;
        auVar324._16_4_ = 0xff800000;
        auVar324._20_4_ = 0xff800000;
        auVar324._24_4_ = 0xff800000;
        auVar324._28_4_ = 0xff800000;
        auVar283._8_4_ = 0x7f800000;
        auVar283._0_8_ = 0x7f8000007f800000;
        auVar283._12_4_ = 0x7f800000;
        auVar283._16_4_ = 0x7f800000;
        auVar283._20_4_ = 0x7f800000;
        auVar283._24_4_ = 0x7f800000;
        auVar283._28_4_ = 0x7f800000;
        auVar33 = vblendvps_avx(auVar283,auVar324,auVar38);
        auVar29 = vpmovsxwd_avx(auVar233);
        auVar233 = vpunpckhwd_avx(auVar233,auVar233);
        auVar247._16_16_ = auVar233;
        auVar247._0_16_ = auVar29;
        auVar151 = vblendvps_avx(auVar151,auVar33,auVar247);
        auVar284._8_4_ = 0xff800000;
        auVar284._0_8_ = 0xff800000ff800000;
        auVar284._12_4_ = 0xff800000;
        auVar284._16_4_ = 0xff800000;
        auVar284._20_4_ = 0xff800000;
        auVar284._24_4_ = 0xff800000;
        auVar284._28_4_ = 0xff800000;
        local_9c0 = vblendvps_avx(auVar284,auVar283,auVar38);
        auVar115 = vblendvps_avx(auVar115,local_9c0,auVar247);
        auVar213._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
        auVar213._8_4_ = auVar113._8_4_ ^ 0xffffffff;
        auVar213._12_4_ = auVar113._12_4_ ^ 0xffffffff;
        auVar213._16_4_ = auVar113._16_4_ ^ 0xffffffff;
        auVar213._20_4_ = auVar113._20_4_ ^ 0xffffffff;
        auVar213._24_4_ = auVar113._24_4_ ^ 0xffffffff;
        auVar213._28_4_ = auVar113._28_4_ ^ 0xffffffff;
        auVar113 = vorps_avx(auVar38,auVar213);
        auVar113 = vandps_avx(auVar34,auVar113);
      }
    }
    auVar321._8_4_ = 0x7fffffff;
    auVar321._0_8_ = 0x7fffffff7fffffff;
    auVar321._12_4_ = 0x7fffffff;
    auVar321._16_4_ = 0x7fffffff;
    auVar321._20_4_ = 0x7fffffff;
    auVar321._24_4_ = 0x7fffffff;
    auVar321._28_4_ = 0x7fffffff;
    auVar34 = local_5c0 & auVar113;
    auVar33 = _local_900;
    auVar364 = local_3a0;
    auVar348 = local_6c0;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0x7f,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar34 >> 0xbf,0) == '\0') &&
        (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f]) {
LAB_008d18e4:
      auVar351 = ZEXT3264(auVar348);
      auVar285 = ZEXT3264(local_9c0);
      auVar365 = ZEXT3264(auVar364);
      auVar325 = ZEXT3264(auVar321);
      auVar259 = ZEXT3264(auVar33);
    }
    else {
      auVar325 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar233 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_9e0._0_4_));
      auVar233 = vshufps_avx(auVar233,auVar233,0);
      auVar242._16_16_ = auVar233;
      auVar242._0_16_ = auVar233;
      auVar38 = vminps_avx(auVar242,auVar115);
      fVar252 = fStack_8e4 + auVar233._12_4_;
      auVar152._0_4_ =
           (float)local_8e0._0_4_ * fVar359 +
           (float)local_900._0_4_ * fVar344 + (float)local_920._0_4_ * fVar372;
      auVar152._4_4_ =
           (float)local_8e0._4_4_ * fVar366 +
           (float)local_900._4_4_ * fVar352 + (float)local_920._4_4_ * fVar376;
      auVar152._8_4_ = fStack_8d8 * fVar367 + fStack_8f8 * fVar353 + fStack_918 * fVar378;
      auVar152._12_4_ = fStack_8d4 * fVar368 + fStack_8f4 * fVar354 + fStack_914 * fVar380;
      auVar152._16_4_ = fStack_8d0 * fVar369 + fStack_8f0 * fVar355 + fStack_910 * fVar382;
      auVar152._20_4_ = fStack_8cc * fVar370 + fStack_8ec * fVar356 + fStack_90c * fVar384;
      auVar152._24_4_ = fStack_8c8 * fVar371 + fStack_8e8 * fVar357 + fStack_908 * fVar386;
      auVar152._28_4_ = fStack_224 + fStack_204 + fStack_224;
      auVar33 = vrcpps_avx(auVar152);
      fVar131 = auVar33._0_4_;
      fVar133 = auVar33._4_4_;
      auVar62._4_4_ = auVar152._4_4_ * fVar133;
      auVar62._0_4_ = auVar152._0_4_ * fVar131;
      fVar135 = auVar33._8_4_;
      auVar62._8_4_ = auVar152._8_4_ * fVar135;
      fVar129 = auVar33._12_4_;
      auVar62._12_4_ = auVar152._12_4_ * fVar129;
      fVar132 = auVar33._16_4_;
      auVar62._16_4_ = auVar152._16_4_ * fVar132;
      fVar134 = auVar33._20_4_;
      auVar62._20_4_ = auVar152._20_4_ * fVar134;
      fVar136 = auVar33._24_4_;
      auVar62._24_4_ = auVar152._24_4_ * fVar136;
      auVar62._28_4_ = fVar252;
      auVar298._8_4_ = 0x3f800000;
      auVar298._0_8_ = 0x3f8000003f800000;
      auVar298._12_4_ = 0x3f800000;
      auVar298._16_4_ = 0x3f800000;
      auVar298._20_4_ = 0x3f800000;
      auVar298._24_4_ = 0x3f800000;
      auVar298._28_4_ = 0x3f800000;
      auVar116 = vsubps_avx(auVar298,auVar62);
      auVar33 = vandps_avx(auVar321,auVar152);
      auVar390._8_4_ = 0x219392ef;
      auVar390._0_8_ = 0x219392ef219392ef;
      auVar390._12_4_ = 0x219392ef;
      auVar390._16_4_ = 0x219392ef;
      auVar390._20_4_ = 0x219392ef;
      auVar390._24_4_ = 0x219392ef;
      auVar390._28_4_ = 0x219392ef;
      auVar34 = vcmpps_avx(auVar33,auVar390,1);
      auVar63._4_4_ =
           (fVar133 + fVar133 * auVar116._4_4_) *
           -(fVar366 * fVar248 + fVar352 * fVar307 + fVar336 * fVar376);
      auVar63._0_4_ =
           (fVar131 + fVar131 * auVar116._0_4_) *
           -(fVar359 * fVar253 + fVar344 * fVar130 + fVar329 * fVar372);
      auVar63._8_4_ =
           (fVar135 + fVar135 * auVar116._8_4_) *
           -(fVar367 * fVar272 + fVar353 * fVar271 + fVar338 * fVar378);
      auVar63._12_4_ =
           (fVar129 + fVar129 * auVar116._12_4_) *
           -(fVar368 * fVar288 + fVar354 * fVar287 + fVar340 * fVar380);
      auVar63._16_4_ =
           (fVar132 + fVar132 * auVar116._16_4_) *
           -(fVar369 * fVar310 + fVar355 * fVar308 + fVar341 * fVar382);
      auVar63._20_4_ =
           (fVar134 + fVar134 * auVar116._20_4_) *
           -(fVar370 * fVar393 + fVar356 * fVar392 + fVar342 * fVar384);
      auVar63._24_4_ =
           (fVar136 + fVar136 * auVar116._24_4_) *
           -(fVar371 * fVar26 + fVar357 * fVar25 + fVar343 * fVar386);
      auVar63._28_4_ = -(auVar36._28_4_ + fVar252);
      auVar33 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,1);
      auVar33 = vorps_avx(auVar34,auVar33);
      auVar364._8_4_ = 0xff800000;
      auVar364._0_8_ = 0xff800000ff800000;
      auVar364._12_4_ = 0xff800000;
      auVar364._16_4_ = 0xff800000;
      auVar364._20_4_ = 0xff800000;
      auVar364._24_4_ = 0xff800000;
      auVar364._28_4_ = 0xff800000;
      auVar33 = vblendvps_avx(auVar63,auVar364,auVar33);
      auVar36 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,6);
      auVar34 = vorps_avx(auVar34,auVar36);
      auVar375._8_4_ = 0x7f800000;
      auVar375._0_8_ = 0x7f8000007f800000;
      auVar375._12_4_ = 0x7f800000;
      auVar375._16_4_ = 0x7f800000;
      auVar375._20_4_ = 0x7f800000;
      auVar375._24_4_ = 0x7f800000;
      auVar375._28_4_ = 0x7f800000;
      auVar34 = vblendvps_avx(auVar63,auVar375,auVar34);
      auVar36 = vmaxps_avx(local_340,auVar151);
      auVar36 = vmaxps_avx(auVar36,auVar33);
      auVar38 = vminps_avx(auVar38,auVar34);
      auVar116 = ZEXT832(0) << 0x20;
      auVar33 = vsubps_avx(auVar116,local_aa0);
      auVar34 = vsubps_avx(auVar116,auVar211);
      auVar64._4_4_ = auVar34._4_4_ * -fVar377;
      auVar64._0_4_ = auVar34._0_4_ * -fVar373;
      auVar64._8_4_ = auVar34._8_4_ * -fVar379;
      auVar64._12_4_ = auVar34._12_4_ * -fVar381;
      auVar64._16_4_ = auVar34._16_4_ * -fVar383;
      auVar64._20_4_ = auVar34._20_4_ * -fVar385;
      auVar64._24_4_ = auVar34._24_4_ * -fVar387;
      auVar64._28_4_ = auVar34._28_4_;
      auVar65._4_4_ = fVar301 * auVar33._4_4_;
      auVar65._0_4_ = fVar167 * auVar33._0_4_;
      auVar65._8_4_ = fVar268 * auVar33._8_4_;
      auVar65._12_4_ = fVar280 * auVar33._12_4_;
      auVar65._16_4_ = fVar302 * auVar33._16_4_;
      auVar65._20_4_ = fVar327 * auVar33._20_4_;
      auVar65._24_4_ = fVar23 * auVar33._24_4_;
      auVar65._28_4_ = auVar33._28_4_;
      auVar33 = vsubps_avx(auVar64,auVar65);
      auVar34 = vsubps_avx(auVar116,auVar31);
      auVar66._4_4_ = fVar304 * auVar34._4_4_;
      auVar66._0_4_ = fVar168 * auVar34._0_4_;
      auVar66._8_4_ = fVar269 * auVar34._8_4_;
      auVar66._12_4_ = fVar286 * auVar34._12_4_;
      auVar66._16_4_ = fVar305 * auVar34._16_4_;
      auVar66._20_4_ = fVar358 * auVar34._20_4_;
      uVar8 = auVar34._28_4_;
      auVar66._24_4_ = fVar24 * auVar34._24_4_;
      auVar66._28_4_ = uVar8;
      auVar34 = vsubps_avx(auVar33,auVar66);
      auVar67._4_4_ = (float)local_920._4_4_ * -fVar377;
      auVar67._0_4_ = (float)local_920._0_4_ * -fVar373;
      auVar67._8_4_ = fStack_918 * -fVar379;
      auVar67._12_4_ = fStack_914 * -fVar381;
      auVar67._16_4_ = fStack_910 * -fVar383;
      auVar67._20_4_ = fStack_90c * -fVar385;
      auVar67._24_4_ = fStack_908 * -fVar387;
      auVar67._28_4_ = -fVar46;
      auVar68._4_4_ = (float)local_900._4_4_ * fVar301;
      auVar68._0_4_ = (float)local_900._0_4_ * fVar167;
      auVar68._8_4_ = fStack_8f8 * fVar268;
      auVar68._12_4_ = fStack_8f4 * fVar280;
      auVar68._16_4_ = fStack_8f0 * fVar302;
      auVar68._20_4_ = fStack_8ec * fVar327;
      auVar68._24_4_ = fStack_8e8 * fVar23;
      auVar68._28_4_ = uVar8;
      auVar348._8_4_ = 0x3f800000;
      auVar348._0_8_ = 0x3f8000003f800000;
      auVar348._12_4_ = 0x3f800000;
      auVar348._16_4_ = 0x3f800000;
      auVar348._20_4_ = 0x3f800000;
      auVar348._24_4_ = 0x3f800000;
      auVar348._28_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = (float)local_8e0._4_4_ * fVar304;
      auVar69._0_4_ = (float)local_8e0._0_4_ * fVar168;
      auVar69._8_4_ = fStack_8d8 * fVar269;
      auVar69._12_4_ = fStack_8d4 * fVar286;
      auVar69._16_4_ = fStack_8d0 * fVar305;
      auVar69._20_4_ = fStack_8cc * fVar358;
      auVar69._24_4_ = fStack_8c8 * fVar24;
      auVar69._28_4_ = uVar8;
      auVar211 = vsubps_avx(auVar33,auVar69);
      auVar33 = vrcpps_avx(auVar211);
      fVar167 = auVar33._0_4_;
      fVar168 = auVar33._4_4_;
      auVar70._4_4_ = auVar211._4_4_ * fVar168;
      auVar70._0_4_ = auVar211._0_4_ * fVar167;
      fVar130 = auVar33._8_4_;
      auVar70._8_4_ = auVar211._8_4_ * fVar130;
      fVar253 = auVar33._12_4_;
      auVar70._12_4_ = auVar211._12_4_ * fVar253;
      fVar301 = auVar33._16_4_;
      auVar70._16_4_ = auVar211._16_4_ * fVar301;
      fVar304 = auVar33._20_4_;
      auVar70._20_4_ = auVar211._20_4_ * fVar304;
      fVar307 = auVar33._24_4_;
      auVar70._24_4_ = auVar211._24_4_ * fVar307;
      auVar70._28_4_ = fStack_8c4;
      auVar31 = vsubps_avx(auVar348,auVar70);
      auVar117._8_4_ = 0x7fffffff;
      auVar117._0_8_ = 0x7fffffff7fffffff;
      auVar117._12_4_ = 0x7fffffff;
      auVar117._16_4_ = 0x7fffffff;
      auVar117._20_4_ = 0x7fffffff;
      auVar117._24_4_ = 0x7fffffff;
      auVar117._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar211,auVar117);
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar118._16_4_ = 0x219392ef;
      auVar118._20_4_ = 0x219392ef;
      auVar118._24_4_ = 0x219392ef;
      auVar118._28_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar33,auVar118,1);
      auVar82 = ZEXT812(0);
      auVar334 = ZEXT1264(auVar82) << 0x20;
      auVar71._4_4_ = (fVar168 + fVar168 * auVar31._4_4_) * -auVar34._4_4_;
      auVar71._0_4_ = (fVar167 + fVar167 * auVar31._0_4_) * -auVar34._0_4_;
      auVar71._8_4_ = (fVar130 + fVar130 * auVar31._8_4_) * -auVar34._8_4_;
      auVar71._12_4_ = (fVar253 + fVar253 * auVar31._12_4_) * -auVar34._12_4_;
      auVar71._16_4_ = (fVar301 + fVar301 * auVar31._16_4_) * -auVar34._16_4_;
      auVar71._20_4_ = (fVar304 + fVar304 * auVar31._20_4_) * -auVar34._20_4_;
      auVar71._24_4_ = (fVar307 + fVar307 * auVar31._24_4_) * -auVar34._24_4_;
      auVar71._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar34 = vcmpps_avx(auVar211,ZEXT1232(auVar82) << 0x20,1);
      auVar34 = vorps_avx(auVar33,auVar34);
      auVar34 = vblendvps_avx(auVar71,auVar364,auVar34);
      local_9c0 = vmaxps_avx(auVar36,auVar34);
      auVar34 = vcmpps_avx(auVar211,ZEXT1232(auVar82) << 0x20,6);
      auVar34 = vorps_avx(auVar33,auVar34);
      auVar34 = vblendvps_avx(auVar71,auVar375,auVar34);
      auVar113 = vandps_avx(auVar113,local_5c0);
      local_3e0 = vminps_avx(auVar38,auVar34);
      auVar34 = vcmpps_avx(local_9c0,local_3e0,2);
      auVar211 = auVar113 & auVar34;
      if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar211 >> 0x7f,0) == '\0') &&
            (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar211 >> 0xbf,0) == '\0') &&
          (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar211[0x1f]) {
        auVar321._8_4_ = 0x7fffffff;
        auVar321._0_8_ = 0x7fffffff7fffffff;
        auVar321._12_4_ = 0x7fffffff;
        auVar321._16_4_ = 0x7fffffff;
        auVar321._20_4_ = 0x7fffffff;
        auVar321._24_4_ = 0x7fffffff;
        auVar321._28_4_ = 0x7fffffff;
        goto LAB_008d18e4;
      }
      auVar33 = vminps_avx(_local_b20,auVar114);
      auVar211 = vminps_avx(auVar30,auVar35);
      auVar33 = vminps_avx(auVar33,auVar211);
      auVar211 = vsubps_avx(auVar33,local_2c0);
      auVar113 = vandps_avx(auVar34,auVar113);
      auVar90._4_4_ = fStack_35c;
      auVar90._0_4_ = local_360;
      auVar90._8_4_ = fStack_358;
      auVar90._12_4_ = fStack_354;
      auVar90._16_4_ = fStack_350;
      auVar90._20_4_ = fStack_34c;
      auVar90._24_4_ = fStack_348;
      auVar90._28_4_ = fStack_344;
      auVar33 = vminps_avx(auVar90,auVar348);
      auVar222 = SUB6428(ZEXT864(0),0) << 0x20;
      auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
      fVar167 = DAT_01f7b060._28_4_;
      local_1a0[0] = fVar169 + fVar137 * (auVar33._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1a0[1] = fVar194 + fVar163 * (auVar33._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1a0[2] = fVar195 + fVar164 * (auVar33._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1a0[3] = fVar196 + fVar165 * (auVar33._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_190 = fVar169 + fVar137 * (auVar33._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_18c = fVar194 + fVar163 * (auVar33._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_188 = fVar195 + fVar164 * (auVar33._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_184 = fVar196 + auVar33._28_4_ + fVar167;
      auVar89._4_4_ = fStack_37c;
      auVar89._0_4_ = local_380;
      auVar89._8_4_ = fStack_378;
      auVar89._12_4_ = fStack_374;
      auVar89._16_4_ = fStack_370;
      auVar89._20_4_ = fStack_36c;
      auVar89._24_4_ = fStack_368;
      auVar89._28_4_ = fStack_364;
      auVar33 = vminps_avx(auVar89,auVar348);
      auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar169 + fVar137 * (auVar33._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1c0[1] = fVar194 + fVar163 * (auVar33._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1c0[2] = fVar195 + fVar164 * (auVar33._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1c0[3] = fVar196 + fVar165 * (auVar33._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_1b0 = fVar169 + fVar137 * (auVar33._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_1ac = fVar194 + fVar163 * (auVar33._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_1a8 = fVar195 + fVar164 * (auVar33._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_1a4 = fVar196 + auVar33._28_4_ + fVar167;
      auVar72._4_4_ = auVar211._4_4_ * 0.99999976;
      auVar72._0_4_ = auVar211._0_4_ * 0.99999976;
      auVar72._8_4_ = auVar211._8_4_ * 0.99999976;
      auVar72._12_4_ = auVar211._12_4_ * 0.99999976;
      auVar72._16_4_ = auVar211._16_4_ * 0.99999976;
      auVar72._20_4_ = auVar211._20_4_ * 0.99999976;
      auVar72._24_4_ = auVar211._24_4_ * 0.99999976;
      auVar72._28_4_ = 0x3f7ffffc;
      auVar33 = vmaxps_avx(ZEXT1232(auVar82) << 0x20,auVar72);
      auVar73._4_4_ = auVar33._4_4_ * auVar33._4_4_;
      auVar73._0_4_ = auVar33._0_4_ * auVar33._0_4_;
      auVar73._8_4_ = auVar33._8_4_ * auVar33._8_4_;
      auVar73._12_4_ = auVar33._12_4_ * auVar33._12_4_;
      auVar73._16_4_ = auVar33._16_4_ * auVar33._16_4_;
      auVar73._20_4_ = auVar33._20_4_ * auVar33._20_4_;
      auVar73._24_4_ = auVar33._24_4_ * auVar33._24_4_;
      auVar73._28_4_ = auVar33._28_4_;
      local_a00 = vsubps_avx(auVar37,auVar73);
      auVar74._4_4_ = local_a00._4_4_ * fVar126 * 4.0;
      auVar74._0_4_ = local_a00._0_4_ * fVar335 * 4.0;
      auVar74._8_4_ = local_a00._8_4_ * fVar127 * 4.0;
      auVar74._12_4_ = local_a00._12_4_ * fVar128 * 4.0;
      auVar74._16_4_ = local_a00._16_4_ * fStack_890;
      auVar74._20_4_ = local_a00._20_4_ * fStack_88c;
      auVar74._24_4_ = local_a00._24_4_ * fStack_888;
      auVar74._28_4_ = auVar33._28_4_;
      auVar34 = vsubps_avx(auVar56,auVar74);
      auVar33 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,5);
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0x7f,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0xbf,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f])
      {
        auVar259 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar238 = SUB6428(ZEXT864(0),0) << 0x20;
        _local_b20 = ZEXT432(0) << 0x20;
        _local_cc0 = local_b20._0_28_;
        auVar299._8_4_ = 0x7f800000;
        auVar299._0_8_ = 0x7f8000007f800000;
        auVar299._12_4_ = 0x7f800000;
        auVar299._16_4_ = 0x7f800000;
        auVar299._20_4_ = 0x7f800000;
        auVar299._24_4_ = 0x7f800000;
        auVar299._28_4_ = 0x7f800000;
        auVar349._8_4_ = 0xff800000;
        auVar349._0_8_ = 0xff800000ff800000;
        auVar349._12_4_ = 0xff800000;
        auVar349._16_4_ = 0xff800000;
        auVar349._20_4_ = 0xff800000;
        auVar349._24_4_ = 0xff800000;
        auVar349._28_4_ = 0xff800000;
        local_a00 = auVar39;
      }
      else {
        auVar211 = vrcpps_avx(local_320);
        fVar335 = auVar211._0_4_;
        auVar225._0_4_ = local_320._0_4_ * fVar335;
        fVar168 = auVar211._4_4_;
        auVar225._4_4_ = local_320._4_4_ * fVar168;
        fVar130 = auVar211._8_4_;
        auVar225._8_4_ = local_320._8_4_ * fVar130;
        fVar253 = auVar211._12_4_;
        auVar225._12_4_ = local_320._12_4_ * fVar253;
        fVar301 = auVar211._16_4_;
        auVar225._16_4_ = local_320._16_4_ * fVar301;
        fVar304 = auVar211._20_4_;
        auVar225._20_4_ = local_320._20_4_ * fVar304;
        fVar307 = auVar211._24_4_;
        auVar225._24_4_ = local_320._24_4_ * fVar307;
        auVar225._28_4_ = 0;
        auVar31 = vsubps_avx(auVar348,auVar225);
        auVar30 = vsqrtps_avx(auVar34);
        fVar335 = fVar335 + fVar335 * auVar31._0_4_;
        fVar168 = fVar168 + fVar168 * auVar31._4_4_;
        fVar130 = fVar130 + fVar130 * auVar31._8_4_;
        fVar253 = fVar253 + fVar253 * auVar31._12_4_;
        fVar301 = fVar301 + fVar301 * auVar31._16_4_;
        fVar304 = fVar304 + fVar304 * auVar31._20_4_;
        fVar307 = fVar307 + fVar307 * auVar31._24_4_;
        auVar35 = vsubps_avx(local_a40,auVar30);
        fVar287 = auVar35._0_4_ * fVar335;
        fVar288 = auVar35._4_4_ * fVar168;
        auVar75._4_4_ = fVar288;
        auVar75._0_4_ = fVar287;
        fVar302 = auVar35._8_4_ * fVar130;
        auVar75._8_4_ = fVar302;
        fVar305 = auVar35._12_4_ * fVar253;
        auVar75._12_4_ = fVar305;
        fVar308 = auVar35._16_4_ * fVar301;
        auVar75._16_4_ = fVar308;
        fVar310 = auVar35._20_4_ * fVar304;
        auVar75._20_4_ = fVar310;
        fVar327 = auVar35._24_4_ * fVar307;
        auVar75._24_4_ = fVar327;
        auVar75._28_4_ = 0x3f800000;
        auVar35 = vsubps_avx(auVar30,local_3c0);
        fVar335 = auVar35._0_4_ * fVar335;
        fVar168 = auVar35._4_4_ * fVar168;
        auVar186._4_4_ = fVar168;
        auVar186._0_4_ = fVar335;
        fVar130 = auVar35._8_4_ * fVar130;
        auVar186._8_4_ = fVar130;
        fVar253 = auVar35._12_4_ * fVar253;
        auVar186._12_4_ = fVar253;
        fVar301 = auVar35._16_4_ * fVar301;
        auVar186._16_4_ = fVar301;
        fVar304 = auVar35._20_4_ * fVar304;
        auVar186._20_4_ = fVar304;
        fVar307 = auVar35._24_4_ * fVar307;
        auVar186._24_4_ = fVar307;
        auVar186._28_4_ = fVar196;
        fVar248 = (fVar287 * local_6a0 + local_6c0._0_4_) * fVar260;
        fVar268 = (fVar288 * fStack_69c + local_6c0._4_4_) * fVar261;
        fVar269 = (fVar302 * fStack_698 + local_6c0._8_4_) * fVar274;
        fVar271 = (fVar305 * fStack_694 + local_6c0._12_4_) * fVar289;
        fVar272 = (fVar308 * fStack_690 + local_6c0._16_4_) * fVar312;
        fVar280 = (fVar310 * fStack_68c + local_6c0._20_4_) * fVar249;
        fVar286 = (fVar327 * fStack_688 + local_6c0._24_4_) * fVar251;
        auVar120._0_4_ = local_a20 + fVar248 * fVar166;
        auVar120._4_4_ = fStack_a1c + fVar268 * fVar292;
        auVar120._8_4_ = fStack_a18 + fVar269 * fVar265;
        auVar120._12_4_ = fStack_a14 + fVar271 * fVar278;
        auVar120._16_4_ = fStack_a10 + fVar272 * fVar293;
        auVar120._20_4_ = fStack_a0c + fVar280 * fVar326;
        auVar120._24_4_ = fStack_a08 + fVar286 * fVar22;
        auVar120._28_4_ = fStack_a04 + auVar211._28_4_ + auVar31._28_4_ + local_6c0._28_4_;
        auVar76._4_4_ = (float)local_8e0._4_4_ * fVar288;
        auVar76._0_4_ = (float)local_8e0._0_4_ * fVar287;
        auVar76._8_4_ = fStack_8d8 * fVar302;
        auVar76._12_4_ = fStack_8d4 * fVar305;
        auVar76._16_4_ = fStack_8d0 * fVar308;
        auVar76._20_4_ = fStack_8cc * fVar310;
        auVar76._24_4_ = fStack_8c8 * fVar327;
        auVar76._28_4_ = auVar30._28_4_;
        local_aa0 = vsubps_avx(auVar76,auVar120);
        auVar243._0_4_ = fVar294 + fVar248 * fVar337;
        auVar243._4_4_ = fVar303 + fVar268 * fVar263;
        auVar243._8_4_ = fVar306 + fVar269 * fVar264;
        auVar243._12_4_ = fVar309 + fVar271 * fVar275;
        auVar243._16_4_ = fVar311 + fVar272 * fVar290;
        auVar243._20_4_ = fVar313 + fVar280 * fVar314;
        auVar243._24_4_ = fVar315 + fVar286 * fVar20;
        auVar243._28_4_ = fVar317 + auVar30._28_4_;
        auVar91._4_4_ = fVar288 * (float)local_900._4_4_;
        auVar91._0_4_ = fVar287 * (float)local_900._0_4_;
        auVar91._8_4_ = fVar302 * fStack_8f8;
        auVar91._12_4_ = fVar305 * fStack_8f4;
        auVar91._16_4_ = fVar308 * fStack_8f0;
        auVar91._20_4_ = fVar310 * fStack_8ec;
        auVar91._24_4_ = fVar327 * fStack_8e8;
        auVar91._28_4_ = fVar167;
        _local_b20 = vsubps_avx(auVar91,auVar243);
        auVar226._0_4_ = (float)local_d00._0_4_ + fVar339 * fVar248;
        auVar226._4_4_ = (float)local_d00._4_4_ + fVar267 * fVar268;
        auVar226._8_4_ = fStack_cf8 + fVar250 * fVar269;
        auVar226._12_4_ = fStack_cf4 + fVar277 * fVar271;
        auVar226._16_4_ = fStack_cf0 + fVar291 * fVar272;
        auVar226._20_4_ = fStack_cec + fVar316 * fVar280;
        auVar226._24_4_ = fStack_ce8 + fVar21 * fVar286;
        auVar226._28_4_ = fStack_ce4 + auVar35._28_4_;
        auVar77._4_4_ = (float)local_920._4_4_ * fVar288;
        auVar77._0_4_ = (float)local_920._0_4_ * fVar287;
        auVar77._8_4_ = fStack_918 * fVar302;
        auVar77._12_4_ = fStack_914 * fVar305;
        auVar77._16_4_ = fStack_910 * fVar308;
        auVar77._20_4_ = fStack_90c * fVar310;
        auVar77._24_4_ = fStack_908 * fVar327;
        auVar77._28_4_ = local_b20._28_4_;
        auVar211 = vsubps_avx(auVar77,auVar226);
        _local_cc0 = auVar211._0_28_;
        fVar260 = (fVar335 * local_6a0 + local_6c0._0_4_) * fVar260;
        fVar261 = (fVar168 * fStack_69c + local_6c0._4_4_) * fVar261;
        fVar274 = (fVar130 * fStack_698 + local_6c0._8_4_) * fVar274;
        fVar289 = (fVar253 * fStack_694 + local_6c0._12_4_) * fVar289;
        fVar312 = (fVar301 * fStack_690 + local_6c0._16_4_) * fVar312;
        fVar249 = (fVar304 * fStack_68c + local_6c0._20_4_) * fVar249;
        fVar251 = (fVar307 * fStack_688 + local_6c0._24_4_) * fVar251;
        auVar227._0_4_ = local_a20 + fVar260 * fVar166;
        auVar227._4_4_ = fStack_a1c + fVar261 * fVar292;
        auVar227._8_4_ = fStack_a18 + fVar274 * fVar265;
        auVar227._12_4_ = fStack_a14 + fVar289 * fVar278;
        auVar227._16_4_ = fStack_a10 + fVar312 * fVar293;
        auVar227._20_4_ = fStack_a0c + fVar249 * fVar326;
        auVar227._24_4_ = fStack_a08 + fVar251 * fVar22;
        auVar227._28_4_ = fStack_a04 + auVar211._28_4_ + local_6c0._28_4_;
        auVar78._4_4_ = (float)local_8e0._4_4_ * fVar168;
        auVar78._0_4_ = (float)local_8e0._0_4_ * fVar335;
        auVar78._8_4_ = fStack_8d8 * fVar130;
        auVar78._12_4_ = fStack_8d4 * fVar253;
        auVar78._16_4_ = fStack_8d0 * fVar301;
        auVar78._20_4_ = fStack_8cc * fVar304;
        auVar78._24_4_ = fStack_8c8 * fVar307;
        auVar78._28_4_ = fVar167;
        auVar211 = vsubps_avx(auVar78,auVar227);
        auVar222 = auVar211._0_28_;
        auVar258._0_4_ = fVar294 + fVar260 * fVar337;
        auVar258._4_4_ = fVar303 + fVar261 * fVar263;
        auVar258._8_4_ = fVar306 + fVar274 * fVar264;
        auVar258._12_4_ = fVar309 + fVar289 * fVar275;
        auVar258._16_4_ = fVar311 + fVar312 * fVar290;
        auVar258._20_4_ = fVar313 + fVar249 * fVar314;
        auVar258._24_4_ = fVar315 + fVar251 * fVar20;
        auVar258._28_4_ = fVar317 + fVar167;
        auVar79._4_4_ = (float)local_900._4_4_ * fVar168;
        auVar79._0_4_ = (float)local_900._0_4_ * fVar335;
        auVar79._8_4_ = fStack_8f8 * fVar130;
        auVar79._12_4_ = fStack_8f4 * fVar253;
        auVar79._16_4_ = fStack_8f0 * fVar301;
        auVar79._20_4_ = fStack_8ec * fVar304;
        auVar79._24_4_ = fStack_8e8 * fVar307;
        auVar79._28_4_ = fStack_8c4;
        auVar211 = vsubps_avx(auVar79,auVar258);
        auVar259 = ZEXT3264(auVar211);
        auVar244._0_4_ = (float)local_d00._0_4_ + fVar339 * fVar260;
        auVar244._4_4_ = (float)local_d00._4_4_ + fVar267 * fVar261;
        auVar244._8_4_ = fStack_cf8 + fVar250 * fVar274;
        auVar244._12_4_ = fStack_cf4 + fVar277 * fVar289;
        auVar244._16_4_ = fStack_cf0 + fVar291 * fVar312;
        auVar244._20_4_ = fStack_cec + fVar316 * fVar249;
        auVar244._24_4_ = fStack_ce8 + fVar21 * fVar251;
        auVar244._28_4_ = fStack_ce4 + local_b20._28_4_;
        auVar80._4_4_ = (float)local_920._4_4_ * fVar168;
        auVar80._0_4_ = (float)local_920._0_4_ * fVar335;
        auVar80._8_4_ = fStack_918 * fVar130;
        auVar80._12_4_ = fStack_914 * fVar253;
        auVar80._16_4_ = fStack_910 * fVar301;
        auVar80._20_4_ = fStack_90c * fVar304;
        auVar80._24_4_ = fStack_908 * fVar307;
        auVar80._28_4_ = fStack_8c4;
        auVar211 = vsubps_avx(auVar80,auVar244);
        auVar238 = auVar211._0_28_;
        auVar34 = vcmpps_avx(auVar34,_DAT_01f7b000,5);
        auVar300._8_4_ = 0x7f800000;
        auVar300._0_8_ = 0x7f8000007f800000;
        auVar300._12_4_ = 0x7f800000;
        auVar300._16_4_ = 0x7f800000;
        auVar300._20_4_ = 0x7f800000;
        auVar300._24_4_ = 0x7f800000;
        auVar300._28_4_ = 0x7f800000;
        auVar299 = vblendvps_avx(auVar300,auVar75,auVar34);
        auVar211 = vmaxps_avx(local_620,local_300);
        auVar81._4_4_ = auVar211._4_4_ * 1.9073486e-06;
        auVar81._0_4_ = auVar211._0_4_ * 1.9073486e-06;
        auVar81._8_4_ = auVar211._8_4_ * 1.9073486e-06;
        auVar81._12_4_ = auVar211._12_4_ * 1.9073486e-06;
        auVar81._16_4_ = auVar211._16_4_ * 1.9073486e-06;
        auVar81._20_4_ = auVar211._20_4_ * 1.9073486e-06;
        auVar81._24_4_ = auVar211._24_4_ * 1.9073486e-06;
        auVar81._28_4_ = auVar211._28_4_;
        auVar211 = vcmpps_avx(local_3a0,auVar81,1);
        auVar350._8_4_ = 0xff800000;
        auVar350._0_8_ = 0xff800000ff800000;
        auVar350._12_4_ = 0xff800000;
        auVar350._16_4_ = 0xff800000;
        auVar350._20_4_ = 0xff800000;
        auVar350._24_4_ = 0xff800000;
        auVar350._28_4_ = 0xff800000;
        auVar349 = vblendvps_avx(auVar350,auVar186,auVar34);
        auVar30 = auVar34 & auVar211;
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0x7f,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0xbf,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar30[0x1f] < '\0') {
          auVar33 = vandps_avx(auVar211,auVar34);
          auVar233 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
          auVar30 = vcmpps_avx(local_a00,_DAT_01f7b000,2);
          auVar186._8_4_ = 0xff800000;
          auVar186._0_8_ = 0xff800000ff800000;
          auVar186._12_4_ = 0xff800000;
          auVar186._16_4_ = 0xff800000;
          auVar186._20_4_ = 0xff800000;
          auVar186._24_4_ = 0xff800000;
          auVar186._28_4_ = 0xff800000;
          auVar333._8_4_ = 0x7f800000;
          auVar333._0_8_ = 0x7f8000007f800000;
          auVar333._12_4_ = 0x7f800000;
          auVar333._16_4_ = 0x7f800000;
          auVar333._20_4_ = 0x7f800000;
          auVar333._24_4_ = 0x7f800000;
          auVar333._28_4_ = 0x7f800000;
          auVar211 = vblendvps_avx(auVar333,auVar186,auVar30);
          auVar29 = vpmovsxwd_avx(auVar233);
          auVar233 = vpunpckhwd_avx(auVar233,auVar233);
          auVar391._16_16_ = auVar233;
          auVar391._0_16_ = auVar29;
          auVar299 = vblendvps_avx(auVar299,auVar211,auVar391);
          auVar211 = vblendvps_avx(auVar186,auVar333,auVar30);
          auVar349 = vblendvps_avx(auVar349,auVar211,auVar391);
          auVar214._0_8_ = auVar33._0_8_ ^ 0xffffffffffffffff;
          auVar214._8_4_ = auVar33._8_4_ ^ 0xffffffff;
          auVar214._12_4_ = auVar33._12_4_ ^ 0xffffffff;
          auVar214._16_4_ = auVar33._16_4_ ^ 0xffffffff;
          auVar214._20_4_ = auVar33._20_4_ ^ 0xffffffff;
          auVar214._24_4_ = auVar33._24_4_ ^ 0xffffffff;
          auVar214._28_4_ = auVar33._28_4_ ^ 0xffffffff;
          auVar33 = vorps_avx(auVar30,auVar214);
          auVar33 = vandps_avx(auVar34,auVar33);
        }
        auVar334 = ZEXT3264(local_aa0);
      }
      auVar351 = ZEXT3264(auVar349);
      auVar285 = ZEXT3264(auVar186);
      auVar365 = ZEXT3264(local_9c0);
      _local_440 = local_9c0;
      local_420 = vminps_avx(local_3e0,auVar299);
      auVar211 = vmaxps_avx(local_9c0,auVar349);
      _local_400 = auVar211;
      auVar34 = vcmpps_avx(local_9c0,local_420,2);
      local_820 = vandps_avx(auVar34,auVar113);
      auVar34 = vcmpps_avx(auVar211,local_3e0,2);
      auVar113 = vandps_avx(auVar113,auVar34);
      auVar34 = vorps_avx(local_820,auVar113);
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') {
        auVar285 = ZEXT3264(_local_920);
        fVar335 = auVar259._0_4_;
        fVar337 = auVar259._4_4_;
        fVar339 = auVar259._8_4_;
        fVar166 = auVar259._12_4_;
        fVar167 = auVar259._16_4_;
        fVar168 = auVar259._20_4_;
        fVar130 = auVar259._24_4_;
        auVar259 = ZEXT3264(_local_900);
        auVar189._0_8_ = auVar33._0_8_ ^ 0xffffffffffffffff;
        auVar189._8_4_ = auVar33._8_4_ ^ 0xffffffff;
        auVar189._12_4_ = auVar33._12_4_ ^ 0xffffffff;
        auVar189._16_4_ = auVar33._16_4_ ^ 0xffffffff;
        auVar189._20_4_ = auVar33._20_4_ ^ 0xffffffff;
        auVar189._24_4_ = auVar33._24_4_ ^ 0xffffffff;
        fVar253 = auVar33._28_4_;
        auVar189._28_4_ = (uint)fVar253 ^ 0xffffffff;
        auVar351 = ZEXT3264(local_820);
        auVar153._0_4_ =
             (float)local_8e0._0_4_ * auVar222._0_4_ +
             (float)local_900._0_4_ * fVar335 + (float)local_920._0_4_ * auVar238._0_4_;
        auVar153._4_4_ =
             (float)local_8e0._4_4_ * auVar222._4_4_ +
             (float)local_900._4_4_ * fVar337 + (float)local_920._4_4_ * auVar238._4_4_;
        auVar153._8_4_ =
             fStack_8d8 * auVar222._8_4_ + fStack_8f8 * fVar339 + fStack_918 * auVar238._8_4_;
        auVar153._12_4_ =
             fStack_8d4 * auVar222._12_4_ + fStack_8f4 * fVar166 + fStack_914 * auVar238._12_4_;
        auVar153._16_4_ =
             fStack_8d0 * auVar222._16_4_ + fStack_8f0 * fVar167 + fStack_910 * auVar238._16_4_;
        auVar153._20_4_ =
             fStack_8cc * auVar222._20_4_ + fStack_8ec * fVar168 + fStack_90c * auVar238._20_4_;
        auVar153._24_4_ =
             fStack_8c8 * auVar222._24_4_ + fStack_8e8 * fVar130 + fStack_908 * auVar238._24_4_;
        auVar153._28_4_ = fVar253 + auVar113._28_4_ + auVar34._28_4_;
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar33 = vandps_avx(auVar153,auVar228);
        auVar245._8_4_ = 0x3e99999a;
        auVar245._0_8_ = 0x3e99999a3e99999a;
        auVar245._12_4_ = 0x3e99999a;
        auVar245._16_4_ = 0x3e99999a;
        auVar245._20_4_ = 0x3e99999a;
        auVar245._24_4_ = 0x3e99999a;
        auVar245._28_4_ = 0x3e99999a;
        auVar33 = vcmpps_avx(auVar33,auVar245,1);
        local_860 = vorps_avx(auVar33,auVar189);
        auVar121._0_4_ =
             (float)local_8e0._0_4_ * auVar334._0_4_ +
             (float)local_900._0_4_ * (float)local_b20._0_4_ +
             (float)local_920._0_4_ * (float)local_cc0._0_4_;
        auVar121._4_4_ =
             (float)local_8e0._4_4_ * auVar334._4_4_ +
             (float)local_900._4_4_ * (float)local_b20._4_4_ +
             (float)local_920._4_4_ * (float)local_cc0._4_4_;
        auVar121._8_4_ =
             fStack_8d8 * auVar334._8_4_ + fStack_8f8 * fStack_b18 + fStack_918 * fStack_cb8;
        auVar121._12_4_ =
             fStack_8d4 * auVar334._12_4_ + fStack_8f4 * fStack_b14 + fStack_914 * fStack_cb4;
        auVar121._16_4_ =
             fStack_8d0 * auVar334._16_4_ + fStack_8f0 * fStack_b10 + fStack_910 * fStack_cb0;
        auVar121._20_4_ =
             fStack_8cc * auVar334._20_4_ + fStack_8ec * fStack_b0c + fStack_90c * fStack_cac;
        auVar121._24_4_ =
             fStack_8c8 * auVar334._24_4_ + fStack_8e8 * fStack_b08 + fStack_908 * fStack_ca8;
        auVar121._28_4_ = local_860._28_4_ + auVar33._28_4_ + fVar253;
        auVar33 = vandps_avx(auVar121,auVar228);
        auVar33 = vcmpps_avx(auVar33,auVar245,1);
        auVar33 = vorps_avx(auVar33,auVar189);
        auVar154._8_4_ = 3;
        auVar154._0_8_ = 0x300000003;
        auVar154._12_4_ = 3;
        auVar154._16_4_ = 3;
        auVar154._20_4_ = 3;
        auVar154._24_4_ = 3;
        auVar154._28_4_ = 3;
        auVar190._8_4_ = 2;
        auVar190._0_8_ = 0x200000002;
        auVar190._12_4_ = 2;
        auVar190._16_4_ = 2;
        auVar190._20_4_ = 2;
        auVar190._24_4_ = 2;
        auVar190._28_4_ = 2;
        auVar33 = vblendvps_avx(auVar190,auVar154,auVar33);
        local_880 = ZEXT432(local_d04);
        local_8a0 = vpshufd_avx(ZEXT416(local_d04),0);
        auVar233 = vpcmpgtd_avx(auVar33._16_16_,local_8a0);
        auVar29 = vpcmpgtd_avx(auVar33._0_16_,local_8a0);
        auVar155._16_16_ = auVar233;
        auVar155._0_16_ = auVar29;
        local_840 = vblendps_avx(ZEXT1632(auVar29),auVar155,0xf0);
        local_460 = vandnps_avx(local_840,local_820);
        local_9a0._4_4_ = local_9c0._4_4_ + (float)local_8c0._4_4_;
        local_9a0._0_4_ = local_9c0._0_4_ + (float)local_8c0._0_4_;
        fStack_998 = local_9c0._8_4_ + fStack_8b8;
        fStack_994 = local_9c0._12_4_ + fStack_8b4;
        fStack_990 = local_9c0._16_4_ + fStack_8b0;
        fStack_98c = local_9c0._20_4_ + fStack_8ac;
        fStack_988 = local_9c0._24_4_ + fStack_8a8;
        fStack_984 = local_9c0._28_4_ + fStack_8a4;
        while( true ) {
          local_c80 = auVar17._0_4_;
          fStack_c7c = auVar17._4_4_;
          fStack_c78 = auVar17._8_4_;
          fStack_c74 = auVar17._12_4_;
          local_c70 = auVar28._0_4_;
          fStack_c6c = auVar28._4_4_;
          fStack_c68 = auVar28._8_4_;
          fStack_c64 = auVar28._12_4_;
          if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_460 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_460 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_460 >> 0x7f,0) == '\0') &&
                (local_460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_460 >> 0xbf,0) == '\0') &&
              (local_460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_460[0x1f]) break;
          auVar156._8_4_ = 0x7f800000;
          auVar156._0_8_ = 0x7f8000007f800000;
          auVar156._12_4_ = 0x7f800000;
          auVar156._16_4_ = 0x7f800000;
          auVar156._20_4_ = 0x7f800000;
          auVar156._24_4_ = 0x7f800000;
          auVar156._28_4_ = 0x7f800000;
          auVar33 = vblendvps_avx(auVar156,local_9c0,local_460);
          auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
          auVar34 = vminps_avx(auVar33,auVar34);
          auVar30 = vshufpd_avx(auVar34,auVar34,5);
          auVar34 = vminps_avx(auVar34,auVar30);
          auVar30 = vperm2f128_avx(auVar34,auVar34,1);
          auVar34 = vminps_avx(auVar34,auVar30);
          auVar34 = vcmpps_avx(auVar33,auVar34,0);
          auVar30 = local_460 & auVar34;
          auVar33 = local_460;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            auVar33 = vandps_avx(auVar34,local_460);
          }
          uVar93 = vmovmskps_avx(auVar33);
          uVar95 = 0;
          if (uVar93 != 0) {
            for (; (uVar93 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
            }
          }
          uVar94 = (ulong)uVar95;
          *(undefined4 *)(local_460 + uVar94 * 4) = 0;
          fVar335 = local_1a0[uVar94];
          uVar95 = *(uint *)(local_440 + uVar94 * 4);
          fVar337 = auVar139._0_4_;
          if ((float)local_a60._0_4_ < 0.0) {
            auVar259 = ZEXT1664(auVar259._0_16_);
            auVar334 = ZEXT1664(auVar334._0_16_);
            auVar351 = ZEXT1664(auVar351._0_16_);
            auVar365 = ZEXT1664(auVar365._0_16_);
            fVar337 = sqrtf((float)local_a60._0_4_);
            uVar94 = extraout_RAX;
          }
          auVar285 = ZEXT464((uint)fVar335);
          auVar29 = vminps_avx(auVar28,_local_b30);
          auVar233 = vmaxps_avx(auVar28,_local_b30);
          auVar175 = vminps_avx(auVar17,_local_b40);
          auVar107 = vminps_avx(auVar29,auVar175);
          auVar29 = vmaxps_avx(auVar17,_local_b40);
          auVar175 = vmaxps_avx(auVar233,auVar29);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar233 = vandps_avx(auVar107,auVar201);
          auVar29 = vandps_avx(auVar175,auVar201);
          auVar233 = vmaxps_avx(auVar233,auVar29);
          auVar29 = vmovshdup_avx(auVar233);
          auVar29 = vmaxss_avx(auVar29,auVar233);
          auVar233 = vshufpd_avx(auVar233,auVar233,1);
          auVar233 = vmaxss_avx(auVar233,auVar29);
          local_b20._0_4_ = auVar233._0_4_ * 1.9073486e-06;
          local_a00._0_4_ = fVar337 * 1.9073486e-06;
          local_a40._0_16_ = vshufps_avx(auVar175,auVar175,0xff);
          auVar233 = vinsertps_avx(ZEXT416(uVar95),ZEXT416((uint)fVar335),0x10);
          for (uVar100 = 0; bVar92 = (byte)uVar94, uVar100 != 5; uVar100 = uVar100 + 1) {
            auVar29 = vmovshdup_avx(auVar233);
            fVar335 = auVar29._0_4_;
            fVar167 = 1.0 - fVar335;
            fVar337 = fVar167 * fVar167 * fVar167;
            fVar339 = fVar335 * fVar335 * fVar335;
            fVar166 = fVar335 * fVar167;
            auVar29 = vshufps_avx(ZEXT416((uint)(fVar339 * 0.16666667)),
                                  ZEXT416((uint)(fVar339 * 0.16666667)),0);
            auVar175 = ZEXT416((uint)((fVar339 * 4.0 + fVar337 +
                                      fVar335 * fVar166 * 12.0 + fVar167 * fVar166 * 6.0) *
                                     0.16666667));
            auVar175 = vshufps_avx(auVar175,auVar175,0);
            auVar107 = ZEXT416((uint)((fVar337 * 4.0 + fVar339 +
                                      fVar167 * fVar166 * 12.0 + fVar335 * fVar166 * 6.0) *
                                     0.16666667));
            auVar107 = vshufps_avx(auVar107,auVar107,0);
            auVar141 = vshufps_avx(auVar233,auVar233,0);
            auVar176._0_4_ = auVar141._0_4_ * (float)local_a50._0_4_ + 0.0;
            auVar176._4_4_ = auVar141._4_4_ * (float)local_a50._4_4_ + 0.0;
            auVar176._8_4_ = auVar141._8_4_ * fStack_a48 + 0.0;
            auVar176._12_4_ = auVar141._12_4_ * fStack_a44 + 0.0;
            auVar141 = vshufps_avx(ZEXT416((uint)(fVar337 * 0.16666667)),
                                   ZEXT416((uint)(fVar337 * 0.16666667)),0);
            auVar105._0_4_ =
                 auVar141._0_4_ * local_c70 +
                 auVar107._0_4_ * (float)local_b30._0_4_ +
                 auVar29._0_4_ * (float)local_b40._0_4_ + auVar175._0_4_ * local_c80;
            auVar105._4_4_ =
                 auVar141._4_4_ * fStack_c6c +
                 auVar107._4_4_ * (float)local_b30._4_4_ +
                 auVar29._4_4_ * (float)local_b40._4_4_ + auVar175._4_4_ * fStack_c7c;
            auVar105._8_4_ =
                 auVar141._8_4_ * fStack_c68 +
                 auVar107._8_4_ * fStack_b28 +
                 auVar29._8_4_ * fStack_b38 + auVar175._8_4_ * fStack_c78;
            auVar105._12_4_ =
                 auVar141._12_4_ * fStack_c64 +
                 auVar107._12_4_ * fStack_b24 +
                 auVar29._12_4_ * fStack_b34 + auVar175._12_4_ * fStack_c74;
            local_aa0._0_16_ = auVar105;
            auVar29 = vsubps_avx(auVar176,auVar105);
            local_a20 = auVar29._0_4_;
            fStack_a1c = auVar29._4_4_;
            fStack_a18 = auVar29._8_4_;
            fStack_a14 = auVar29._12_4_;
            auVar29 = vdpps_avx(auVar29,auVar29,0x7f);
            fVar337 = auVar29._0_4_;
            if (fVar337 < 0.0) {
              fVar339 = sqrtf(fVar337);
              uVar94 = extraout_RAX_00;
            }
            else {
              auVar175 = vsqrtss_avx(auVar29,auVar29);
              fVar339 = auVar175._0_4_;
            }
            auVar175 = ZEXT416((uint)(fVar335 * fVar335 * 0.5));
            auVar175 = vshufps_avx(auVar175,auVar175,0);
            auVar107 = ZEXT416((uint)((fVar167 * fVar167 + fVar166 * 4.0) * 0.5));
            auVar107 = vshufps_avx(auVar107,auVar107,0);
            auVar141 = ZEXT416((uint)((fVar335 * -fVar335 - fVar166 * 4.0) * 0.5));
            auVar141 = vshufps_avx(auVar141,auVar141,0);
            auVar106 = ZEXT416((uint)(fVar167 * -fVar167 * 0.5));
            auVar106 = vshufps_avx(auVar106,auVar106,0);
            auVar296._0_4_ =
                 local_c70 * auVar106._0_4_ +
                 (float)local_b30._0_4_ * auVar141._0_4_ +
                 (float)local_b40._0_4_ * auVar175._0_4_ + local_c80 * auVar107._0_4_;
            auVar296._4_4_ =
                 fStack_c6c * auVar106._4_4_ +
                 (float)local_b30._4_4_ * auVar141._4_4_ +
                 (float)local_b40._4_4_ * auVar175._4_4_ + fStack_c7c * auVar107._4_4_;
            auVar296._8_4_ =
                 fStack_c68 * auVar106._8_4_ +
                 fStack_b28 * auVar141._8_4_ +
                 fStack_b38 * auVar175._8_4_ + fStack_c78 * auVar107._8_4_;
            auVar296._12_4_ =
                 fStack_c64 * auVar106._12_4_ +
                 fStack_b24 * auVar141._12_4_ +
                 fStack_b34 * auVar175._12_4_ + fStack_c74 * auVar107._12_4_;
            auVar175 = vshufps_avx(auVar233,auVar233,0x55);
            auVar107 = ZEXT416((uint)(fVar167 - (fVar335 + fVar335)));
            auVar141 = vshufps_avx(auVar107,auVar107,0);
            auVar107 = ZEXT416((uint)(fVar335 - (fVar167 + fVar167)));
            auVar106 = vshufps_avx(auVar107,auVar107,0);
            auVar18 = vshufps_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),0);
            auVar107 = vdpps_avx(auVar296,auVar296,0x7f);
            auVar142._0_4_ =
                 local_c70 * auVar18._0_4_ +
                 (float)local_b30._0_4_ * auVar106._0_4_ +
                 (float)local_b40._0_4_ * auVar175._0_4_ + local_c80 * auVar141._0_4_;
            auVar142._4_4_ =
                 fStack_c6c * auVar18._4_4_ +
                 (float)local_b30._4_4_ * auVar106._4_4_ +
                 (float)local_b40._4_4_ * auVar175._4_4_ + fStack_c7c * auVar141._4_4_;
            auVar142._8_4_ =
                 fStack_c68 * auVar18._8_4_ +
                 fStack_b28 * auVar106._8_4_ +
                 fStack_b38 * auVar175._8_4_ + fStack_c78 * auVar141._8_4_;
            auVar142._12_4_ =
                 fStack_c64 * auVar18._12_4_ +
                 fStack_b24 * auVar106._12_4_ +
                 fStack_b34 * auVar175._12_4_ + fStack_c74 * auVar141._12_4_;
            auVar175 = vblendps_avx(auVar107,_DAT_01f45a50,0xe);
            auVar141 = vrsqrtss_avx(auVar175,auVar175);
            fVar166 = auVar141._0_4_;
            fVar335 = auVar107._0_4_;
            auVar141 = vdpps_avx(auVar296,auVar142,0x7f);
            auVar106 = vshufps_avx(auVar107,auVar107,0);
            auVar143._0_4_ = auVar142._0_4_ * auVar106._0_4_;
            auVar143._4_4_ = auVar142._4_4_ * auVar106._4_4_;
            auVar143._8_4_ = auVar142._8_4_ * auVar106._8_4_;
            auVar143._12_4_ = auVar142._12_4_ * auVar106._12_4_;
            auVar141 = vshufps_avx(auVar141,auVar141,0);
            auVar218._0_4_ = auVar296._0_4_ * auVar141._0_4_;
            auVar218._4_4_ = auVar296._4_4_ * auVar141._4_4_;
            auVar218._8_4_ = auVar296._8_4_ * auVar141._8_4_;
            auVar218._12_4_ = auVar296._12_4_ * auVar141._12_4_;
            auVar18 = vsubps_avx(auVar143,auVar218);
            auVar141 = vrcpss_avx(auVar175,auVar175);
            auVar175 = vmaxss_avx(ZEXT416((uint)local_b20._0_4_),
                                  ZEXT416((uint)(auVar233._0_4_ * (float)local_a00._0_4_)));
            auVar351 = ZEXT1664(auVar175);
            auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar335 * auVar141._0_4_)));
            auVar141 = vshufps_avx(auVar141,auVar141,0);
            uVar83 = CONCAT44(auVar296._4_4_,auVar296._0_4_);
            auVar234._0_8_ = uVar83 ^ 0x8000000080000000;
            auVar234._8_4_ = -auVar296._8_4_;
            auVar234._12_4_ = -auVar296._12_4_;
            auVar106 = ZEXT416((uint)(fVar166 * 1.5 + fVar335 * -0.5 * fVar166 * fVar166 * fVar166))
            ;
            auVar106 = vshufps_avx(auVar106,auVar106,0);
            auVar202._0_4_ = auVar106._0_4_ * auVar18._0_4_ * auVar141._0_4_;
            auVar202._4_4_ = auVar106._4_4_ * auVar18._4_4_ * auVar141._4_4_;
            auVar202._8_4_ = auVar106._8_4_ * auVar18._8_4_ * auVar141._8_4_;
            auVar202._12_4_ = auVar106._12_4_ * auVar18._12_4_ * auVar141._12_4_;
            auVar256._0_4_ = auVar296._0_4_ * auVar106._0_4_;
            auVar256._4_4_ = auVar296._4_4_ * auVar106._4_4_;
            auVar256._8_4_ = auVar296._8_4_ * auVar106._8_4_;
            auVar256._12_4_ = auVar296._12_4_ * auVar106._12_4_;
            if (fVar335 < 0.0) {
              local_a80._0_16_ = auVar202;
              fVar335 = sqrtf(fVar335);
              auVar351 = ZEXT464(auVar175._0_4_);
              uVar94 = extraout_RAX_01;
              auVar202 = local_a80._0_16_;
            }
            else {
              auVar107 = vsqrtss_avx(auVar107,auVar107);
              fVar335 = auVar107._0_4_;
            }
            auVar86._4_4_ = fStack_a1c;
            auVar86._0_4_ = local_a20;
            auVar86._8_4_ = fStack_a18;
            auVar86._12_4_ = fStack_a14;
            auVar107 = vdpps_avx(auVar86,auVar256,0x7f);
            fVar335 = ((float)local_b20._0_4_ / fVar335) * (fVar339 + 1.0) +
                      auVar351._0_4_ + fVar339 * (float)local_b20._0_4_;
            auVar141 = vdpps_avx(auVar234,auVar256,0x7f);
            auVar106 = vdpps_avx(auVar86,auVar202,0x7f);
            auVar18 = vdpps_avx(_local_a50,auVar256,0x7f);
            auVar102 = vdpps_avx(auVar86,auVar234,0x7f);
            fVar339 = auVar141._0_4_ + auVar106._0_4_;
            fVar166 = auVar107._0_4_;
            auVar108._0_4_ = fVar166 * fVar166;
            auVar108._4_4_ = auVar107._4_4_ * auVar107._4_4_;
            auVar108._8_4_ = auVar107._8_4_ * auVar107._8_4_;
            auVar108._12_4_ = auVar107._12_4_ * auVar107._12_4_;
            auVar106 = vsubps_avx(auVar29,auVar108);
            auVar141 = vdpps_avx(auVar86,_local_a50,0x7f);
            fVar167 = auVar102._0_4_ - fVar166 * fVar339;
            fVar168 = auVar141._0_4_ - fVar166 * auVar18._0_4_;
            auVar141 = vrsqrtss_avx(auVar106,auVar106);
            fVar130 = auVar106._0_4_;
            fVar166 = auVar141._0_4_;
            fVar166 = fVar166 * 1.5 + fVar130 * -0.5 * fVar166 * fVar166 * fVar166;
            if (fVar130 < 0.0) {
              local_a80._0_16_ = ZEXT416((uint)fVar339);
              local_940._0_4_ = fVar167;
              local_960._0_4_ = fVar168;
              local_980._0_4_ = fVar166;
              fVar130 = sqrtf(fVar130);
              auVar351 = ZEXT464(auVar175._0_4_);
              uVar94 = extraout_RAX_02;
              fVar166 = (float)local_980._0_4_;
              fVar167 = (float)local_940._0_4_;
              fVar168 = (float)local_960._0_4_;
              auVar175 = local_a80._0_16_;
            }
            else {
              auVar175 = vsqrtss_avx(auVar106,auVar106);
              fVar130 = auVar175._0_4_;
              auVar175 = ZEXT416((uint)fVar339);
            }
            auVar365 = ZEXT1664(auVar107);
            auVar285 = ZEXT1664(auVar29);
            auVar334 = ZEXT1664(auVar296);
            auVar109 = vpermilps_avx(local_aa0._0_16_,0xff);
            auVar102 = vshufps_avx(auVar296,auVar296,0xff);
            fVar167 = fVar167 * fVar166 - auVar102._0_4_;
            auVar219._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
            auVar219._8_4_ = auVar18._8_4_ ^ 0x80000000;
            auVar219._12_4_ = auVar18._12_4_ ^ 0x80000000;
            auVar235._0_4_ = -fVar167;
            auVar235._4_4_ = 0x80000000;
            auVar235._8_4_ = 0x80000000;
            auVar235._12_4_ = 0x80000000;
            fVar339 = auVar175._0_4_ * fVar168 * fVar166;
            auVar259 = ZEXT464((uint)fVar339);
            auVar141 = vinsertps_avx(auVar235,ZEXT416((uint)(fVar168 * fVar166)),0x1c);
            auVar106 = vmovsldup_avx(ZEXT416((uint)(fVar339 - auVar18._0_4_ * fVar167)));
            auVar141 = vdivps_avx(auVar141,auVar106);
            auVar175 = vinsertps_avx(auVar175,auVar219,0x10);
            auVar175 = vdivps_avx(auVar175,auVar106);
            auVar106 = vmovsldup_avx(auVar107);
            auVar109 = ZEXT416((uint)(fVar130 - auVar109._0_4_));
            auVar18 = vmovsldup_avx(auVar109);
            auVar177._0_4_ = auVar106._0_4_ * auVar141._0_4_ + auVar18._0_4_ * auVar175._0_4_;
            auVar177._4_4_ = auVar106._4_4_ * auVar141._4_4_ + auVar18._4_4_ * auVar175._4_4_;
            auVar177._8_4_ = auVar106._8_4_ * auVar141._8_4_ + auVar18._8_4_ * auVar175._8_4_;
            auVar177._12_4_ = auVar106._12_4_ * auVar141._12_4_ + auVar18._12_4_ * auVar175._12_4_;
            auVar233 = vsubps_avx(auVar233,auVar177);
            auVar178._8_4_ = 0x7fffffff;
            auVar178._0_8_ = 0x7fffffff7fffffff;
            auVar178._12_4_ = 0x7fffffff;
            auVar175 = vandps_avx(auVar107,auVar178);
            if (auVar175._0_4_ < fVar335) {
              auVar203._8_4_ = 0x7fffffff;
              auVar203._0_8_ = 0x7fffffff7fffffff;
              auVar203._12_4_ = 0x7fffffff;
              auVar175 = vandps_avx(auVar109,auVar203);
              if (auVar175._0_4_ < (float)local_a40._0_4_ * 1.9073486e-06 + auVar351._0_4_ + fVar335
                 ) {
                bVar101 = uVar100 < 5;
                fVar335 = auVar233._0_4_ + (float)local_9e0._0_4_;
                if ((fVar328 <= fVar335) &&
                   (fVar166 = *(float *)(ray + k * 4 + 0x100), fVar335 <= fVar166)) {
                  auVar175 = vmovshdup_avx(auVar233);
                  bVar92 = 0;
                  if ((auVar175._0_4_ < 0.0) || (1.0 < auVar175._0_4_)) goto LAB_008d25e4;
                  auVar175 = vrsqrtss_avx(auVar29,auVar29);
                  fVar167 = auVar175._0_4_;
                  pGVar10 = (context->scene->geometries).items[local_ad8].ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar92 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_008d25e4;
                    auVar175 = ZEXT416((uint)(fVar167 * 1.5 +
                                             fVar337 * -0.5 * fVar167 * fVar167 * fVar167));
                    auVar175 = vshufps_avx(auVar175,auVar175,0);
                    auVar179._0_4_ = auVar175._0_4_ * local_a20;
                    auVar179._4_4_ = auVar175._4_4_ * fStack_a1c;
                    auVar179._8_4_ = auVar175._8_4_ * fStack_a18;
                    auVar179._12_4_ = auVar175._12_4_ * fStack_a14;
                    auVar144._0_4_ = auVar296._0_4_ + auVar102._0_4_ * auVar179._0_4_;
                    auVar144._4_4_ = auVar296._4_4_ + auVar102._4_4_ * auVar179._4_4_;
                    auVar144._8_4_ = auVar296._8_4_ + auVar102._8_4_ * auVar179._8_4_;
                    auVar144._12_4_ = auVar296._12_4_ + auVar102._12_4_ * auVar179._12_4_;
                    auVar175 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar141 = vshufps_avx(auVar296,auVar296,0xc9);
                    auVar180._0_4_ = auVar141._0_4_ * auVar179._0_4_;
                    auVar180._4_4_ = auVar141._4_4_ * auVar179._4_4_;
                    auVar180._8_4_ = auVar141._8_4_ * auVar179._8_4_;
                    auVar180._12_4_ = auVar141._12_4_ * auVar179._12_4_;
                    auVar204._0_4_ = auVar296._0_4_ * auVar175._0_4_;
                    auVar204._4_4_ = auVar296._4_4_ * auVar175._4_4_;
                    auVar204._8_4_ = auVar296._8_4_ * auVar175._8_4_;
                    auVar204._12_4_ = auVar296._12_4_ * auVar175._12_4_;
                    auVar106 = vsubps_avx(auVar204,auVar180);
                    auVar175 = vshufps_avx(auVar106,auVar106,0xc9);
                    auVar141 = vshufps_avx(auVar144,auVar144,0xc9);
                    auVar205._0_4_ = auVar141._0_4_ * auVar175._0_4_;
                    auVar205._4_4_ = auVar141._4_4_ * auVar175._4_4_;
                    auVar205._8_4_ = auVar141._8_4_ * auVar175._8_4_;
                    auVar205._12_4_ = auVar141._12_4_ * auVar175._12_4_;
                    auVar175 = vshufps_avx(auVar106,auVar106,0xd2);
                    auVar145._0_4_ = auVar144._0_4_ * auVar175._0_4_;
                    auVar145._4_4_ = auVar144._4_4_ * auVar175._4_4_;
                    auVar145._8_4_ = auVar144._8_4_ * auVar175._8_4_;
                    auVar145._12_4_ = auVar144._12_4_ * auVar175._12_4_;
                    auVar175 = vsubps_avx(auVar205,auVar145);
                    pRVar15 = context->user;
                    local_780 = vshufps_avx(auVar233,auVar233,0x55);
                    auStack_7d0 = vshufps_avx(auVar175,auVar175,0x55);
                    local_7c0 = vshufps_avx(auVar175,auVar175,0xaa);
                    local_7a0 = vshufps_avx(auVar175,auVar175,0);
                    local_7e0 = (RTCHitN  [16])auStack_7d0;
                    local_760 = ZEXT832(0) << 0x20;
                    local_740 = local_660._0_8_;
                    uStack_738 = local_660._8_8_;
                    uStack_730 = local_660._16_8_;
                    uStack_728 = local_660._24_8_;
                    local_720 = local_640;
                    auVar33 = vcmpps_avx(local_640,local_640,0xf);
                    local_ae0[1] = auVar33;
                    *local_ae0 = auVar33;
                    local_700 = pRVar15->instID[0];
                    local_6e0 = pRVar15->instPrimID[0];
                    *(float *)(ray + k * 4 + 0x100) = fVar335;
                    local_b60 = *local_ae8;
                    local_b50 = *local_af0;
                    local_ad0.valid = (int *)local_b60;
                    local_ad0.geometryUserPtr = pGVar10->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_7e0;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    local_7b0 = local_7c0;
                    local_790 = local_7a0;
                    local_770 = local_780;
                    uStack_6fc = local_700;
                    uStack_6f8 = local_700;
                    uStack_6f4 = local_700;
                    uStack_6f0 = local_700;
                    uStack_6ec = local_700;
                    uStack_6e8 = local_700;
                    uStack_6e4 = local_700;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    uStack_6d0 = local_6e0;
                    uStack_6cc = local_6e0;
                    uStack_6c8 = local_6e0;
                    uStack_6c4 = local_6e0;
                    if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar259 = ZEXT464((uint)fVar339);
                      auVar285 = ZEXT1664(auVar29);
                      auVar334 = ZEXT1664(auVar296);
                      auVar351 = ZEXT1664(auVar351._0_16_);
                      auVar365 = ZEXT1664(auVar107);
                      (*pGVar10->occlusionFilterN)(&local_ad0);
                    }
                    auVar233 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar29 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar191._16_16_ = auVar29;
                    auVar191._0_16_ = auVar233;
                    auVar33 = _DAT_01f7b020 & ~auVar191;
                    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar33 >> 0x7f,0) != '\0') ||
                          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar33 >> 0xbf,0) != '\0') ||
                        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar33[0x1f] < '\0') {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar334 = ZEXT1664(auVar334._0_16_);
                        auVar351 = ZEXT1664(auVar351._0_16_);
                        auVar365 = ZEXT1664(auVar365._0_16_);
                        (*p_Var16)(&local_ad0);
                      }
                      auVar233 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar29 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar122._16_16_ = auVar29;
                      auVar122._0_16_ = auVar233;
                      auVar157._8_4_ = 0xff800000;
                      auVar157._0_8_ = 0xff800000ff800000;
                      auVar157._12_4_ = 0xff800000;
                      auVar157._16_4_ = 0xff800000;
                      auVar157._20_4_ = 0xff800000;
                      auVar157._24_4_ = 0xff800000;
                      auVar157._28_4_ = 0xff800000;
                      auVar33 = vblendvps_avx(auVar157,*(undefined1 (*) [32])(local_ad0.ray + 0x100)
                                              ,auVar122);
                      *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar33;
                      auVar33 = _DAT_01f7b020 & ~auVar122;
                      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar33 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar33 >> 0x7f,0) != '\0') ||
                            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar33 >> 0xbf,0) != '\0') ||
                          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar33[0x1f] < '\0') {
                        bVar92 = 1;
                        goto LAB_008d25e4;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar166;
                    bVar92 = 0;
                    goto LAB_008d25e4;
                  }
                }
                bVar92 = 0;
                goto LAB_008d25e4;
              }
            }
          }
          bVar101 = false;
LAB_008d25e4:
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar322._4_4_ = uVar8;
          auVar322._0_4_ = uVar8;
          auVar322._8_4_ = uVar8;
          auVar322._12_4_ = uVar8;
          auVar322._16_4_ = uVar8;
          auVar322._20_4_ = uVar8;
          auVar322._24_4_ = uVar8;
          auVar322._28_4_ = uVar8;
          auVar325 = ZEXT3264(auVar322);
          bVar96 = bVar96 | bVar101 & bVar92;
          auVar33 = vcmpps_avx(_local_9a0,auVar322,2);
          local_460 = vandps_avx(auVar33,local_460);
        }
        auVar123._0_4_ = (float)local_8c0._0_4_ + auVar211._0_4_;
        auVar123._4_4_ = (float)local_8c0._4_4_ + auVar211._4_4_;
        auVar123._8_4_ = fStack_8b8 + auVar211._8_4_;
        auVar123._12_4_ = fStack_8b4 + auVar211._12_4_;
        auVar123._16_4_ = fStack_8b0 + auVar211._16_4_;
        auVar123._20_4_ = fStack_8ac + auVar211._20_4_;
        auVar123._24_4_ = fStack_8a8 + auVar211._24_4_;
        auVar123._28_4_ = fStack_8a4 + auVar211._28_4_;
        auVar233 = vshufps_avx(auVar325._0_16_,auVar325._0_16_,0);
        auVar158._16_16_ = auVar233;
        auVar158._0_16_ = auVar233;
        auVar33 = vcmpps_avx(auVar123,auVar158,2);
        auVar113 = vandps_avx(auVar33,auVar113);
        auVar124._8_4_ = 3;
        auVar124._0_8_ = 0x300000003;
        auVar124._12_4_ = 3;
        auVar124._16_4_ = 3;
        auVar124._20_4_ = 3;
        auVar124._24_4_ = 3;
        auVar124._28_4_ = 3;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar33 = vblendvps_avx(auVar159,auVar124,local_860);
        auVar233 = vpcmpgtd_avx(auVar33._16_16_,local_8a0);
        auVar29 = vpshufd_avx(local_880._0_16_,0);
        auVar29 = vpcmpgtd_avx(auVar33._0_16_,auVar29);
        auVar160._16_16_ = auVar233;
        auVar160._0_16_ = auVar29;
        _local_9a0 = vblendps_avx(ZEXT1632(auVar29),auVar160,0xf0);
        local_480 = vandnps_avx(_local_9a0,auVar113);
        local_9c0 = _local_400;
        local_c20._4_4_ = (float)local_8c0._4_4_ + (float)local_400._4_4_;
        local_c20._0_4_ = (float)local_8c0._0_4_ + (float)local_400._0_4_;
        fStack_c18 = fStack_8b8 + fStack_3f8;
        fStack_c14 = fStack_8b4 + fStack_3f4;
        fStack_c10 = fStack_8b0 + fStack_3f0;
        fStack_c0c = fStack_8ac + fStack_3ec;
        fStack_c08 = fStack_8a8 + fStack_3e8;
        fStack_c04 = fStack_8a4 + fStack_3e4;
        for (; (((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_480 >> 0x7f,0) != '\0') ||
                 (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_480 >> 0xbf,0) != '\0') ||
               (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_480[0x1f] < '\0'; local_480 = vandps_avx(auVar33,local_480)) {
          auVar161._8_4_ = 0x7f800000;
          auVar161._0_8_ = 0x7f8000007f800000;
          auVar161._12_4_ = 0x7f800000;
          auVar161._16_4_ = 0x7f800000;
          auVar161._20_4_ = 0x7f800000;
          auVar161._24_4_ = 0x7f800000;
          auVar161._28_4_ = 0x7f800000;
          auVar33 = vblendvps_avx(auVar161,local_9c0,local_480);
          auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
          auVar34 = vminps_avx(auVar33,auVar34);
          auVar211 = vshufpd_avx(auVar34,auVar34,5);
          auVar34 = vminps_avx(auVar34,auVar211);
          auVar211 = vperm2f128_avx(auVar34,auVar34,1);
          auVar34 = vminps_avx(auVar34,auVar211);
          auVar34 = vcmpps_avx(auVar33,auVar34,0);
          auVar211 = local_480 & auVar34;
          auVar33 = local_480;
          if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar211 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar211 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar211 >> 0x7f,0) != '\0') ||
                (auVar211 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar211 >> 0xbf,0) != '\0') ||
              (auVar211 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar211[0x1f] < '\0') {
            auVar33 = vandps_avx(auVar34,local_480);
          }
          uVar93 = vmovmskps_avx(auVar33);
          uVar95 = 0;
          if (uVar93 != 0) {
            for (; (uVar93 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
            }
          }
          uVar94 = (ulong)uVar95;
          *(undefined4 *)(local_480 + uVar94 * 4) = 0;
          fVar335 = local_1c0[uVar94];
          uVar95 = *(uint *)(local_3e0 + uVar94 * 4);
          fVar337 = auVar27._0_4_;
          if ((float)local_a60._0_4_ < 0.0) {
            auVar334 = ZEXT1664(auVar334._0_16_);
            auVar351 = ZEXT1664(auVar351._0_16_);
            auVar365 = ZEXT1664(auVar365._0_16_);
            fVar337 = sqrtf((float)local_a60._0_4_);
            uVar94 = extraout_RAX_03;
          }
          auVar259 = ZEXT464((uint)fVar335);
          auVar285 = ZEXT464(uVar95);
          auVar29 = vminps_avx(auVar28,_local_b30);
          auVar233 = vmaxps_avx(auVar28,_local_b30);
          auVar175 = vminps_avx(auVar17,_local_b40);
          auVar107 = vminps_avx(auVar29,auVar175);
          auVar29 = vmaxps_avx(auVar17,_local_b40);
          auVar175 = vmaxps_avx(auVar233,auVar29);
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar233 = vandps_avx(auVar107,auVar206);
          auVar29 = vandps_avx(auVar175,auVar206);
          auVar233 = vmaxps_avx(auVar233,auVar29);
          auVar29 = vmovshdup_avx(auVar233);
          auVar29 = vmaxss_avx(auVar29,auVar233);
          auVar233 = vshufpd_avx(auVar233,auVar233,1);
          auVar233 = vmaxss_avx(auVar233,auVar29);
          local_b20._0_4_ = auVar233._0_4_ * 1.9073486e-06;
          local_a00._0_4_ = fVar337 * 1.9073486e-06;
          local_a40._0_16_ = vshufps_avx(auVar175,auVar175,0xff);
          auVar233 = vinsertps_avx(ZEXT416(uVar95),ZEXT416((uint)fVar335),0x10);
          for (uVar100 = 0; bVar92 = (byte)uVar94, uVar100 != 5; uVar100 = uVar100 + 1) {
            auVar29 = vmovshdup_avx(auVar233);
            fVar335 = auVar29._0_4_;
            fVar167 = 1.0 - fVar335;
            fVar337 = fVar167 * fVar167 * fVar167;
            fVar339 = fVar335 * fVar335 * fVar335;
            fVar166 = fVar335 * fVar167;
            auVar29 = vshufps_avx(ZEXT416((uint)(fVar339 * 0.16666667)),
                                  ZEXT416((uint)(fVar339 * 0.16666667)),0);
            auVar175 = ZEXT416((uint)((fVar339 * 4.0 + fVar337 +
                                      fVar335 * fVar166 * 12.0 + fVar167 * fVar166 * 6.0) *
                                     0.16666667));
            auVar175 = vshufps_avx(auVar175,auVar175,0);
            auVar107 = ZEXT416((uint)((fVar337 * 4.0 + fVar339 +
                                      fVar167 * fVar166 * 12.0 + fVar335 * fVar166 * 6.0) *
                                     0.16666667));
            auVar107 = vshufps_avx(auVar107,auVar107,0);
            auVar141 = vshufps_avx(auVar233,auVar233,0);
            auVar181._0_4_ = auVar141._0_4_ * (float)local_a50._0_4_ + 0.0;
            auVar181._4_4_ = auVar141._4_4_ * (float)local_a50._4_4_ + 0.0;
            auVar181._8_4_ = auVar141._8_4_ * fStack_a48 + 0.0;
            auVar181._12_4_ = auVar141._12_4_ * fStack_a44 + 0.0;
            auVar141 = vshufps_avx(ZEXT416((uint)(fVar337 * 0.16666667)),
                                   ZEXT416((uint)(fVar337 * 0.16666667)),0);
            auVar110._0_4_ =
                 auVar141._0_4_ * local_c70 +
                 auVar107._0_4_ * (float)local_b30._0_4_ +
                 auVar29._0_4_ * (float)local_b40._0_4_ + auVar175._0_4_ * local_c80;
            auVar110._4_4_ =
                 auVar141._4_4_ * fStack_c6c +
                 auVar107._4_4_ * (float)local_b30._4_4_ +
                 auVar29._4_4_ * (float)local_b40._4_4_ + auVar175._4_4_ * fStack_c7c;
            auVar110._8_4_ =
                 auVar141._8_4_ * fStack_c68 +
                 auVar107._8_4_ * fStack_b28 +
                 auVar29._8_4_ * fStack_b38 + auVar175._8_4_ * fStack_c78;
            auVar110._12_4_ =
                 auVar141._12_4_ * fStack_c64 +
                 auVar107._12_4_ * fStack_b24 +
                 auVar29._12_4_ * fStack_b34 + auVar175._12_4_ * fStack_c74;
            local_aa0._0_16_ = auVar110;
            auVar29 = vsubps_avx(auVar181,auVar110);
            local_a20 = auVar29._0_4_;
            fStack_a1c = auVar29._4_4_;
            fStack_a18 = auVar29._8_4_;
            fStack_a14 = auVar29._12_4_;
            auVar29 = vdpps_avx(auVar29,auVar29,0x7f);
            fVar337 = auVar29._0_4_;
            if (fVar337 < 0.0) {
              fVar339 = sqrtf(fVar337);
              uVar94 = extraout_RAX_04;
            }
            else {
              auVar175 = vsqrtss_avx(auVar29,auVar29);
              fVar339 = auVar175._0_4_;
            }
            auVar175 = ZEXT416((uint)(fVar335 * fVar335 * 0.5));
            auVar175 = vshufps_avx(auVar175,auVar175,0);
            auVar107 = ZEXT416((uint)((fVar167 * fVar167 + fVar166 * 4.0) * 0.5));
            auVar107 = vshufps_avx(auVar107,auVar107,0);
            auVar141 = ZEXT416((uint)((fVar335 * -fVar335 - fVar166 * 4.0) * 0.5));
            auVar141 = vshufps_avx(auVar141,auVar141,0);
            auVar106 = ZEXT416((uint)(fVar167 * -fVar167 * 0.5));
            auVar106 = vshufps_avx(auVar106,auVar106,0);
            auVar297._0_4_ =
                 local_c70 * auVar106._0_4_ +
                 (float)local_b30._0_4_ * auVar141._0_4_ +
                 (float)local_b40._0_4_ * auVar175._0_4_ + local_c80 * auVar107._0_4_;
            auVar297._4_4_ =
                 fStack_c6c * auVar106._4_4_ +
                 (float)local_b30._4_4_ * auVar141._4_4_ +
                 (float)local_b40._4_4_ * auVar175._4_4_ + fStack_c7c * auVar107._4_4_;
            auVar297._8_4_ =
                 fStack_c68 * auVar106._8_4_ +
                 fStack_b28 * auVar141._8_4_ +
                 fStack_b38 * auVar175._8_4_ + fStack_c78 * auVar107._8_4_;
            auVar297._12_4_ =
                 fStack_c64 * auVar106._12_4_ +
                 fStack_b24 * auVar141._12_4_ +
                 fStack_b34 * auVar175._12_4_ + fStack_c74 * auVar107._12_4_;
            auVar175 = vshufps_avx(auVar233,auVar233,0x55);
            auVar107 = ZEXT416((uint)(fVar167 - (fVar335 + fVar335)));
            auVar141 = vshufps_avx(auVar107,auVar107,0);
            auVar107 = ZEXT416((uint)(fVar335 - (fVar167 + fVar167)));
            auVar106 = vshufps_avx(auVar107,auVar107,0);
            auVar18 = vshufps_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),0);
            auVar107 = vdpps_avx(auVar297,auVar297,0x7f);
            auVar146._0_4_ =
                 local_c70 * auVar18._0_4_ +
                 (float)local_b30._0_4_ * auVar106._0_4_ +
                 (float)local_b40._0_4_ * auVar175._0_4_ + local_c80 * auVar141._0_4_;
            auVar146._4_4_ =
                 fStack_c6c * auVar18._4_4_ +
                 (float)local_b30._4_4_ * auVar106._4_4_ +
                 (float)local_b40._4_4_ * auVar175._4_4_ + fStack_c7c * auVar141._4_4_;
            auVar146._8_4_ =
                 fStack_c68 * auVar18._8_4_ +
                 fStack_b28 * auVar106._8_4_ +
                 fStack_b38 * auVar175._8_4_ + fStack_c78 * auVar141._8_4_;
            auVar146._12_4_ =
                 fStack_c64 * auVar18._12_4_ +
                 fStack_b24 * auVar106._12_4_ +
                 fStack_b34 * auVar175._12_4_ + fStack_c74 * auVar141._12_4_;
            auVar175 = vblendps_avx(auVar107,_DAT_01f45a50,0xe);
            auVar141 = vrsqrtss_avx(auVar175,auVar175);
            fVar166 = auVar141._0_4_;
            fVar335 = auVar107._0_4_;
            auVar141 = vdpps_avx(auVar297,auVar146,0x7f);
            auVar106 = vshufps_avx(auVar107,auVar107,0);
            auVar147._0_4_ = auVar146._0_4_ * auVar106._0_4_;
            auVar147._4_4_ = auVar146._4_4_ * auVar106._4_4_;
            auVar147._8_4_ = auVar146._8_4_ * auVar106._8_4_;
            auVar147._12_4_ = auVar146._12_4_ * auVar106._12_4_;
            auVar141 = vshufps_avx(auVar141,auVar141,0);
            auVar220._0_4_ = auVar297._0_4_ * auVar141._0_4_;
            auVar220._4_4_ = auVar297._4_4_ * auVar141._4_4_;
            auVar220._8_4_ = auVar297._8_4_ * auVar141._8_4_;
            auVar220._12_4_ = auVar297._12_4_ * auVar141._12_4_;
            auVar18 = vsubps_avx(auVar147,auVar220);
            auVar141 = vrcpss_avx(auVar175,auVar175);
            auVar175 = vmaxss_avx(ZEXT416((uint)local_b20._0_4_),
                                  ZEXT416((uint)(auVar233._0_4_ * (float)local_a00._0_4_)));
            auVar285 = ZEXT1664(auVar175);
            auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar335 * auVar141._0_4_)));
            auVar141 = vshufps_avx(auVar141,auVar141,0);
            uVar83 = CONCAT44(auVar297._4_4_,auVar297._0_4_);
            auVar236._0_8_ = uVar83 ^ 0x8000000080000000;
            auVar236._8_4_ = -auVar297._8_4_;
            auVar236._12_4_ = -auVar297._12_4_;
            auVar106 = ZEXT416((uint)(fVar166 * 1.5 + fVar335 * -0.5 * fVar166 * fVar166 * fVar166))
            ;
            auVar106 = vshufps_avx(auVar106,auVar106,0);
            auVar207._0_4_ = auVar106._0_4_ * auVar18._0_4_ * auVar141._0_4_;
            auVar207._4_4_ = auVar106._4_4_ * auVar18._4_4_ * auVar141._4_4_;
            auVar207._8_4_ = auVar106._8_4_ * auVar18._8_4_ * auVar141._8_4_;
            auVar207._12_4_ = auVar106._12_4_ * auVar18._12_4_ * auVar141._12_4_;
            auVar257._0_4_ = auVar297._0_4_ * auVar106._0_4_;
            auVar257._4_4_ = auVar297._4_4_ * auVar106._4_4_;
            auVar257._8_4_ = auVar297._8_4_ * auVar106._8_4_;
            auVar257._12_4_ = auVar297._12_4_ * auVar106._12_4_;
            if (fVar335 < 0.0) {
              local_a80._0_16_ = auVar207;
              fVar335 = sqrtf(fVar335);
              auVar285 = ZEXT464(auVar175._0_4_);
              uVar94 = extraout_RAX_05;
              auVar207 = local_a80._0_16_;
            }
            else {
              auVar107 = vsqrtss_avx(auVar107,auVar107);
              fVar335 = auVar107._0_4_;
            }
            auVar87._4_4_ = fStack_a1c;
            auVar87._0_4_ = local_a20;
            auVar87._8_4_ = fStack_a18;
            auVar87._12_4_ = fStack_a14;
            auVar107 = vdpps_avx(auVar87,auVar257,0x7f);
            fVar335 = ((float)local_b20._0_4_ / fVar335) * (fVar339 + 1.0) +
                      fVar339 * (float)local_b20._0_4_ + auVar285._0_4_;
            auVar141 = vdpps_avx(auVar236,auVar257,0x7f);
            auVar106 = vdpps_avx(auVar87,auVar207,0x7f);
            auVar18 = vdpps_avx(_local_a50,auVar257,0x7f);
            auVar102 = vdpps_avx(auVar87,auVar236,0x7f);
            fVar339 = auVar141._0_4_ + auVar106._0_4_;
            fVar166 = auVar107._0_4_;
            auVar111._0_4_ = fVar166 * fVar166;
            auVar111._4_4_ = auVar107._4_4_ * auVar107._4_4_;
            auVar111._8_4_ = auVar107._8_4_ * auVar107._8_4_;
            auVar111._12_4_ = auVar107._12_4_ * auVar107._12_4_;
            auVar106 = vsubps_avx(auVar29,auVar111);
            auVar141 = vdpps_avx(auVar87,_local_a50,0x7f);
            fVar167 = auVar102._0_4_ - fVar166 * fVar339;
            fVar168 = auVar141._0_4_ - fVar166 * auVar18._0_4_;
            auVar141 = vrsqrtss_avx(auVar106,auVar106);
            fVar130 = auVar106._0_4_;
            fVar166 = auVar141._0_4_;
            fVar166 = fVar166 * 1.5 + fVar130 * -0.5 * fVar166 * fVar166 * fVar166;
            if (fVar130 < 0.0) {
              local_a80._0_16_ = ZEXT416((uint)fVar339);
              local_940._0_4_ = fVar167;
              local_960._0_4_ = fVar168;
              local_980._0_4_ = fVar166;
              fVar130 = sqrtf(fVar130);
              auVar285 = ZEXT464(auVar175._0_4_);
              uVar94 = extraout_RAX_06;
              fVar166 = (float)local_980._0_4_;
              fVar167 = (float)local_940._0_4_;
              fVar168 = (float)local_960._0_4_;
              auVar175 = local_a80._0_16_;
            }
            else {
              auVar175 = vsqrtss_avx(auVar106,auVar106);
              fVar130 = auVar175._0_4_;
              auVar175 = ZEXT416((uint)fVar339);
            }
            auVar365 = ZEXT464((uint)fVar335);
            auVar334 = ZEXT1664(auVar29);
            auVar351 = ZEXT1664(auVar297);
            auVar109 = vpermilps_avx(local_aa0._0_16_,0xff);
            auVar102 = vshufps_avx(auVar297,auVar297,0xff);
            fVar167 = fVar167 * fVar166 - auVar102._0_4_;
            auVar221._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
            auVar221._8_4_ = auVar18._8_4_ ^ 0x80000000;
            auVar221._12_4_ = auVar18._12_4_ ^ 0x80000000;
            auVar237._0_4_ = -fVar167;
            auVar237._4_4_ = 0x80000000;
            auVar237._8_4_ = 0x80000000;
            auVar237._12_4_ = 0x80000000;
            fVar339 = auVar175._0_4_ * fVar168 * fVar166;
            auVar259 = ZEXT464((uint)fVar339);
            auVar141 = vinsertps_avx(auVar237,ZEXT416((uint)(fVar168 * fVar166)),0x1c);
            auVar106 = vmovsldup_avx(ZEXT416((uint)(fVar339 - auVar18._0_4_ * fVar167)));
            auVar141 = vdivps_avx(auVar141,auVar106);
            auVar175 = vinsertps_avx(auVar175,auVar221,0x10);
            auVar175 = vdivps_avx(auVar175,auVar106);
            auVar106 = vmovsldup_avx(auVar107);
            auVar109 = ZEXT416((uint)(fVar130 - auVar109._0_4_));
            auVar18 = vmovsldup_avx(auVar109);
            auVar182._0_4_ = auVar106._0_4_ * auVar141._0_4_ + auVar18._0_4_ * auVar175._0_4_;
            auVar182._4_4_ = auVar106._4_4_ * auVar141._4_4_ + auVar18._4_4_ * auVar175._4_4_;
            auVar182._8_4_ = auVar106._8_4_ * auVar141._8_4_ + auVar18._8_4_ * auVar175._8_4_;
            auVar182._12_4_ = auVar106._12_4_ * auVar141._12_4_ + auVar18._12_4_ * auVar175._12_4_;
            auVar233 = vsubps_avx(auVar233,auVar182);
            auVar183._8_4_ = 0x7fffffff;
            auVar183._0_8_ = 0x7fffffff7fffffff;
            auVar183._12_4_ = 0x7fffffff;
            auVar175 = vandps_avx(auVar107,auVar183);
            if (auVar175._0_4_ < fVar335) {
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
              auVar175 = vandps_avx(auVar109,auVar208);
              if (auVar175._0_4_ < (float)local_a40._0_4_ * 1.9073486e-06 + fVar335 + auVar285._0_4_
                 ) {
                bVar101 = uVar100 < 5;
                fVar166 = auVar233._0_4_ + (float)local_9e0._0_4_;
                if ((fVar328 <= fVar166) &&
                   (fVar167 = *(float *)(ray + k * 4 + 0x100), fVar166 <= fVar167)) {
                  auVar175 = vmovshdup_avx(auVar233);
                  bVar92 = 0;
                  if ((auVar175._0_4_ < 0.0) || (1.0 < auVar175._0_4_)) goto LAB_008d3130;
                  auVar175 = vrsqrtss_avx(auVar29,auVar29);
                  fVar168 = auVar175._0_4_;
                  pGVar10 = (context->scene->geometries).items[local_ad8].ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar92 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_008d3130;
                    auVar175 = ZEXT416((uint)(fVar168 * 1.5 +
                                             fVar337 * -0.5 * fVar168 * fVar168 * fVar168));
                    auVar175 = vshufps_avx(auVar175,auVar175,0);
                    auVar184._0_4_ = auVar175._0_4_ * local_a20;
                    auVar184._4_4_ = auVar175._4_4_ * fStack_a1c;
                    auVar184._8_4_ = auVar175._8_4_ * fStack_a18;
                    auVar184._12_4_ = auVar175._12_4_ * fStack_a14;
                    auVar148._0_4_ = auVar297._0_4_ + auVar102._0_4_ * auVar184._0_4_;
                    auVar148._4_4_ = auVar297._4_4_ + auVar102._4_4_ * auVar184._4_4_;
                    auVar148._8_4_ = auVar297._8_4_ + auVar102._8_4_ * auVar184._8_4_;
                    auVar148._12_4_ = auVar297._12_4_ + auVar102._12_4_ * auVar184._12_4_;
                    auVar175 = vshufps_avx(auVar184,auVar184,0xc9);
                    auVar107 = vshufps_avx(auVar297,auVar297,0xc9);
                    auVar185._0_4_ = auVar107._0_4_ * auVar184._0_4_;
                    auVar185._4_4_ = auVar107._4_4_ * auVar184._4_4_;
                    auVar185._8_4_ = auVar107._8_4_ * auVar184._8_4_;
                    auVar185._12_4_ = auVar107._12_4_ * auVar184._12_4_;
                    auVar209._0_4_ = auVar297._0_4_ * auVar175._0_4_;
                    auVar209._4_4_ = auVar297._4_4_ * auVar175._4_4_;
                    auVar209._8_4_ = auVar297._8_4_ * auVar175._8_4_;
                    auVar209._12_4_ = auVar297._12_4_ * auVar175._12_4_;
                    auVar141 = vsubps_avx(auVar209,auVar185);
                    auVar175 = vshufps_avx(auVar141,auVar141,0xc9);
                    auVar107 = vshufps_avx(auVar148,auVar148,0xc9);
                    auVar210._0_4_ = auVar107._0_4_ * auVar175._0_4_;
                    auVar210._4_4_ = auVar107._4_4_ * auVar175._4_4_;
                    auVar210._8_4_ = auVar107._8_4_ * auVar175._8_4_;
                    auVar210._12_4_ = auVar107._12_4_ * auVar175._12_4_;
                    auVar175 = vshufps_avx(auVar141,auVar141,0xd2);
                    auVar149._0_4_ = auVar148._0_4_ * auVar175._0_4_;
                    auVar149._4_4_ = auVar148._4_4_ * auVar175._4_4_;
                    auVar149._8_4_ = auVar148._8_4_ * auVar175._8_4_;
                    auVar149._12_4_ = auVar148._12_4_ * auVar175._12_4_;
                    auVar175 = vsubps_avx(auVar210,auVar149);
                    pRVar15 = context->user;
                    local_780 = vshufps_avx(auVar233,auVar233,0x55);
                    auStack_7d0 = vshufps_avx(auVar175,auVar175,0x55);
                    local_7c0 = vshufps_avx(auVar175,auVar175,0xaa);
                    local_7a0 = vshufps_avx(auVar175,auVar175,0);
                    local_7e0 = (RTCHitN  [16])auStack_7d0;
                    local_760 = ZEXT832(0) << 0x20;
                    local_740 = local_660._0_8_;
                    uStack_738 = local_660._8_8_;
                    uStack_730 = local_660._16_8_;
                    uStack_728 = local_660._24_8_;
                    local_720 = local_640;
                    auVar33 = vcmpps_avx(local_640,local_640,0xf);
                    local_ae0[1] = auVar33;
                    *local_ae0 = auVar33;
                    local_700 = pRVar15->instID[0];
                    local_6e0 = pRVar15->instPrimID[0];
                    *(float *)(ray + k * 4 + 0x100) = fVar166;
                    local_b60 = *local_ae8;
                    local_b50 = *local_af0;
                    local_ad0.valid = (int *)local_b60;
                    local_ad0.geometryUserPtr = pGVar10->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_7e0;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    local_7b0 = local_7c0;
                    local_790 = local_7a0;
                    local_770 = local_780;
                    uStack_6fc = local_700;
                    uStack_6f8 = local_700;
                    uStack_6f4 = local_700;
                    uStack_6f0 = local_700;
                    uStack_6ec = local_700;
                    uStack_6e8 = local_700;
                    uStack_6e4 = local_700;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    uStack_6d0 = local_6e0;
                    uStack_6cc = local_6e0;
                    uStack_6c8 = local_6e0;
                    uStack_6c4 = local_6e0;
                    if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar259 = ZEXT464((uint)fVar339);
                      auVar285 = ZEXT1664(auVar285._0_16_);
                      auVar334 = ZEXT1664(auVar29);
                      auVar351 = ZEXT1664(auVar297);
                      auVar365 = ZEXT464((uint)fVar335);
                      (*pGVar10->occlusionFilterN)(&local_ad0);
                    }
                    auVar233 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                    auVar29 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                    auVar192._16_16_ = auVar29;
                    auVar192._0_16_ = auVar233;
                    auVar33 = _DAT_01f7b020 & ~auVar192;
                    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar33 >> 0x7f,0) != '\0') ||
                          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar33 >> 0xbf,0) != '\0') ||
                        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar33[0x1f] < '\0') {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar334 = ZEXT1664(auVar334._0_16_);
                        auVar351 = ZEXT1664(auVar351._0_16_);
                        auVar365 = ZEXT1664(auVar365._0_16_);
                        (*p_Var16)(&local_ad0);
                      }
                      auVar233 = vpcmpeqd_avx(local_b60,ZEXT816(0) << 0x40);
                      auVar29 = vpcmpeqd_avx(local_b50,ZEXT816(0) << 0x40);
                      auVar125._16_16_ = auVar29;
                      auVar125._0_16_ = auVar233;
                      auVar162._8_4_ = 0xff800000;
                      auVar162._0_8_ = 0xff800000ff800000;
                      auVar162._12_4_ = 0xff800000;
                      auVar162._16_4_ = 0xff800000;
                      auVar162._20_4_ = 0xff800000;
                      auVar162._24_4_ = 0xff800000;
                      auVar162._28_4_ = 0xff800000;
                      auVar33 = vblendvps_avx(auVar162,*(undefined1 (*) [32])(local_ad0.ray + 0x100)
                                              ,auVar125);
                      *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar33;
                      auVar33 = _DAT_01f7b020 & ~auVar125;
                      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar33 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar33 >> 0x7f,0) != '\0') ||
                            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar33 >> 0xbf,0) != '\0') ||
                          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar33[0x1f] < '\0') {
                        bVar92 = 1;
                        goto LAB_008d3130;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar167;
                  }
                }
                bVar92 = 0;
                goto LAB_008d3130;
              }
            }
          }
          bVar101 = false;
LAB_008d3130:
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar323._4_4_ = uVar8;
          auVar323._0_4_ = uVar8;
          auVar323._8_4_ = uVar8;
          auVar323._12_4_ = uVar8;
          auVar323._16_4_ = uVar8;
          auVar323._20_4_ = uVar8;
          auVar323._24_4_ = uVar8;
          auVar323._28_4_ = uVar8;
          auVar325 = ZEXT3264(auVar323);
          bVar96 = bVar96 | bVar101 & bVar92;
          auVar33 = vcmpps_avx(_local_c20,auVar323,2);
        }
        auVar33 = vandps_avx(local_840,local_820);
        auVar113 = vandps_avx(_local_9a0,auVar113);
        auVar193._0_4_ = (float)local_8c0._0_4_ + local_440._0_4_;
        auVar193._4_4_ = (float)local_8c0._4_4_ + local_440._4_4_;
        auVar193._8_4_ = fStack_8b8 + local_440._8_4_;
        auVar193._12_4_ = fStack_8b4 + local_440._12_4_;
        auVar193._16_4_ = fStack_8b0 + local_440._16_4_;
        auVar193._20_4_ = fStack_8ac + local_440._20_4_;
        auVar193._24_4_ = fStack_8a8 + local_440._24_4_;
        auVar193._28_4_ = fStack_8a4 + local_440._28_4_;
        auVar233 = vshufps_avx(auVar325._0_16_,auVar325._0_16_,0);
        auVar229._16_16_ = auVar233;
        auVar229._0_16_ = auVar233;
        auVar34 = vcmpps_avx(auVar193,auVar229,2);
        auVar33 = vandps_avx(auVar34,auVar33);
        auVar246._0_4_ = (float)local_8c0._0_4_ + local_400._0_4_;
        auVar246._4_4_ = (float)local_8c0._4_4_ + local_400._4_4_;
        auVar246._8_4_ = fStack_8b8 + local_400._8_4_;
        auVar246._12_4_ = fStack_8b4 + local_400._12_4_;
        auVar246._16_4_ = fStack_8b0 + local_400._16_4_;
        auVar246._20_4_ = fStack_8ac + local_400._20_4_;
        auVar246._24_4_ = fStack_8a8 + local_400._24_4_;
        auVar246._28_4_ = fStack_8a4 + local_400._28_4_;
        auVar34 = vcmpps_avx(auVar246,auVar229,2);
        auVar113 = vandps_avx(auVar34,auVar113);
        auVar113 = vorps_avx(auVar33,auVar113);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          uVar100 = (ulong)uVar97;
          *(undefined1 (*) [32])(auStack_180 + uVar100 * 0x60) = auVar113;
          auVar113 = vblendvps_avx(_local_400,_local_440,auVar33);
          *(undefined1 (*) [32])(auStack_160 + uVar100 * 0x60) = auVar113;
          uVar94 = vmovlps_avx(local_7f0);
          (&uStack_140)[uVar100 * 0xc] = uVar94;
          auStack_138[uVar100 * 0x18] = local_d04 + 1;
          uVar97 = uVar97 + 1;
        }
      }
      auVar325 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
    }
    do {
      uVar95 = uVar97;
      if (uVar95 == 0) {
        if (bVar96 != 0) goto LAB_008d36c0;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar112._4_4_ = uVar8;
        auVar112._0_4_ = uVar8;
        auVar112._8_4_ = uVar8;
        auVar112._12_4_ = uVar8;
        auVar139 = vcmpps_avx(local_800,auVar112,2);
        uVar97 = vmovmskps_avx(auVar139);
        uVar97 = (uint)local_9c8 - 1 & (uint)local_9c8 & uVar97;
        goto LAB_008d0a66;
      }
      uVar94 = (ulong)(uVar95 - 1);
      lVar98 = uVar94 * 0x60;
      auVar113 = *(undefined1 (*) [32])(auStack_160 + lVar98);
      auVar119._0_4_ = auVar113._0_4_ + (float)local_8c0._0_4_;
      auVar119._4_4_ = auVar113._4_4_ + (float)local_8c0._4_4_;
      auVar119._8_4_ = auVar113._8_4_ + fStack_8b8;
      auVar119._12_4_ = auVar113._12_4_ + fStack_8b4;
      auVar119._16_4_ = auVar113._16_4_ + fStack_8b0;
      auVar119._20_4_ = auVar113._20_4_ + fStack_8ac;
      auVar119._24_4_ = auVar113._24_4_ + fStack_8a8;
      auVar119._28_4_ = auVar113._28_4_ + fStack_8a4;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar212._4_4_ = uVar8;
      auVar212._0_4_ = uVar8;
      auVar212._8_4_ = uVar8;
      auVar212._12_4_ = uVar8;
      auVar212._16_4_ = uVar8;
      auVar212._20_4_ = uVar8;
      auVar212._24_4_ = uVar8;
      auVar212._28_4_ = uVar8;
      auVar33 = vcmpps_avx(auVar119,auVar212,2);
      _local_7e0 = vandps_avx(auVar33,*(undefined1 (*) [32])(auStack_180 + lVar98));
      auVar33 = *(undefined1 (*) [32])(auStack_180 + lVar98) & auVar33;
      uVar97 = uVar95 - 1;
    } while ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar33 >> 0x7f,0) == '\0') &&
               (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar33 >> 0xbf,0) == '\0') &&
             (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar33[0x1f]);
    auVar188._8_4_ = 0x7f800000;
    auVar188._0_8_ = 0x7f8000007f800000;
    auVar188._12_4_ = 0x7f800000;
    auVar188._16_4_ = 0x7f800000;
    auVar188._20_4_ = 0x7f800000;
    auVar188._24_4_ = 0x7f800000;
    auVar188._28_4_ = 0x7f800000;
    auVar113 = vblendvps_avx(auVar188,auVar113,_local_7e0);
    auVar33 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar33 = vminps_avx(auVar113,auVar33);
    auVar34 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vminps_avx(auVar33,auVar34);
    auVar34 = vperm2f128_avx(auVar33,auVar33,1);
    auVar33 = vminps_avx(auVar33,auVar34);
    auVar33 = vcmpps_avx(auVar113,auVar33,0);
    auVar34 = _local_7e0 & auVar33;
    auVar113 = _local_7e0;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0x7f,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar34 >> 0xbf,0) != '\0') ||
        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar34[0x1f] < '\0')
    {
      auVar113 = vandps_avx(auVar33,_local_7e0);
    }
    auVar140._8_8_ = 0;
    auVar140._0_8_ = (&uStack_140)[uVar94 * 0xc];
    local_d04 = auStack_138[uVar94 * 0x18];
    uVar97 = vmovmskps_avx(auVar113);
    uVar93 = 0;
    if (uVar97 != 0) {
      for (; (uVar97 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
      }
    }
    *(undefined4 *)(local_7e0 + (ulong)uVar93 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar98) = _local_7e0;
    uVar97 = uVar95 - 1;
    if ((((((((_local_7e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7e0 >> 0x7f,0) != '\0') ||
          (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7e0 >> 0xbf,0) != '\0') ||
        (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7e0[0x1f] < '\0') {
      uVar97 = uVar95;
    }
    auVar233 = vshufps_avx(auVar140,auVar140,0);
    auVar29 = vshufps_avx(auVar140,auVar140,0x55);
    auVar29 = vsubps_avx(auVar29,auVar233);
    local_440._4_4_ = auVar233._4_4_ + auVar29._4_4_ * 0.14285715;
    local_440._0_4_ = auVar233._0_4_ + auVar29._0_4_ * 0.0;
    fStack_438 = auVar233._8_4_ + auVar29._8_4_ * 0.2857143;
    fStack_434 = auVar233._12_4_ + auVar29._12_4_ * 0.42857146;
    fStack_430 = auVar233._0_4_ + auVar29._0_4_ * 0.5714286;
    fStack_42c = auVar233._4_4_ + auVar29._4_4_ * 0.71428573;
    fStack_428 = auVar233._8_4_ + auVar29._8_4_ * 0.8571429;
    fStack_424 = auVar233._12_4_ + auVar29._12_4_;
    local_7f0._8_8_ = 0;
    local_7f0._0_8_ = *(ulong *)(local_440 + (ulong)uVar93 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }